

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int server_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  ptls_iovec_t *ppVar1;
  uint *puVar2;
  undefined1 *puVar3;
  anon_union_120_2_21cbdc79_for_st_ptls_t_21 *secret;
  undefined8 *puVar4;
  uint8_t uVar5;
  ushort uVar6;
  ptls_cipher_suite_t *ppVar7;
  ptls_context_t *ctx;
  char *pcVar8;
  st_ptls_on_extension_t *psVar9;
  st_ptls_on_client_hello_t *psVar10;
  st_ptls_update_esni_key_t *psVar11;
  st_ptls_hash_context_t *psVar12;
  _func_void_st_ptls_hash_context_t_ptr_void_ptr_size_t *p_Var13;
  _func_int_st_ptls_message_emitter_t_ptr *p_Var14;
  code *pcVar15;
  ptls_hash_context_t *ppVar16;
  _func_void_void_ptr_size_t *p_Var17;
  st_ptls_update_traffic_key_t *psVar18;
  _func_int_st_ptls_update_traffic_key_t_ptr_ptls_t_ptr_int_size_t_void_ptr *p_Var19;
  ptls_buffer_t *ppVar20;
  ptls_verify_certificate_t *vc;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  ptls_iovec_t ikm;
  undefined1 auVar24 [16];
  uint8_t **ppuVar25;
  void *pvVar26;
  ptls_key_exchange_algorithm_t *ppVar27;
  ptls_t *ppVar28;
  ptls_message_emitter_t *ppVar29;
  int iVar30;
  uint uVar31;
  en_ptls_state_t eVar32;
  uint uVar33;
  st_ptls_client_hello_t *ch;
  size_t sVar34;
  ptls_key_schedule_t *ppVar35;
  uint8_t *puVar36;
  byte bVar37;
  long lVar38;
  ptls_key_schedule_t *ppVar39;
  ptls_key_schedule_t *ppVar40;
  long lVar41;
  ptls_buffer_t *ppVar42;
  long lVar43;
  ulong uVar44;
  ptls_key_schedule_t *sig;
  uint uVar45;
  ulong uVar46;
  undefined1 auVar47 [8];
  size_t *psVar48;
  ptls_key_schedule_t *ppVar49;
  ptls_key_schedule_t *ppVar50;
  uint8_t *puVar51;
  long lVar52;
  ulong uVar53;
  ushort uVar54;
  undefined4 uVar55;
  uint16_t *puVar56;
  ulong uVar57;
  undefined1 auVar58 [8];
  ulong uVar59;
  ptls_key_schedule_t *end;
  size_t sVar60;
  ptls_handshake_properties_t *ppVar61;
  ptls_hash_context_t **pppVar62;
  size_t sVar63;
  ulong uVar64;
  size_t sVar65;
  bool bVar66;
  undefined1 uVar67;
  bool bVar68;
  ptls_iovec_t tbs;
  ptls_iovec_t pVar69;
  ptls_iovec_t ch_trunc;
  undefined8 uStack_6e0;
  ptls_key_schedule_t local_6d8 [8];
  undefined1 local_378 [416];
  ptls_raw_extension_t *local_1d8;
  ptls_key_exchange_algorithm_t **local_1d0;
  ptls_iovec_t *local_1c8;
  size_t *local_1c0;
  void *pvStack_1b8;
  ptls_iovec_t pubkey;
  ptls_iovec_t ecdh_secret;
  anon_struct_24_2_cc7b932a key_share;
  ptls_key_schedule_t *local_178;
  size_t psk_index;
  undefined1 auStack_168 [8];
  ptls_iovec_t server_name;
  int local_14c;
  ushort uStack_148;
  undefined6 uStack_146;
  int accept_early_data;
  ptls_cipher_suite_t **local_140;
  undefined1 auStack_138 [8];
  ptls_cipher_suite_t *cs;
  uint8_t *local_128;
  size_t local_120;
  ptls_iovec_t *local_118;
  size_t local_110;
  undefined8 local_108;
  size_t sStack_100;
  anon_struct_40_2_1fc0efb2_for_cert_compression_algos *paStack_f8;
  size_t sStack_f0;
  undefined1 local_e8 [24];
  size_t sStack_d0;
  byte local_c8;
  uint16_t local_b6;
  uint local_b4;
  st_ptls_signature_algorithms_t *local_b0;
  ptls_key_schedule_t *local_a8;
  ptls_iovec_t *local_a0;
  ushort local_92;
  undefined8 local_90;
  ptls_key_schedule_t *local_88;
  ptls_handshake_properties_t *local_80;
  undefined8 local_78;
  ptls_key_schedule_t *local_70;
  ptls_key_schedule_t *local_68;
  ptls_buffer_t *local_60;
  ptls_t *local_58;
  ptls_key_schedule_t *local_50;
  ptls_message_emitter_t *local_48;
  ptls_key_schedule_t *local_40;
  ptls_key_schedule_t *local_38;
  
  sVar63 = message.len;
  puVar36 = message.base;
  sig = local_6d8;
  ecdh_secret.len = 0;
  key_share.algorithm = (ptls_key_exchange_algorithm_t *)0x0;
  key_share.peer_key.base = (uint8_t *)0x0;
  local_178 = (ptls_key_schedule_t *)0xffffffffffffffff;
  pvStack_1b8 = (void *)0x0;
  pubkey.base = (uint8_t *)0x0;
  pubkey.len = 0;
  ecdh_secret.base = (uint8_t *)0x0;
  local_14c = 0;
  eVar32 = tls->state;
  local_88 = (ptls_key_schedule_t *)
             CONCAT71(local_88._1_7_,eVar32 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO);
  uStack_6e0 = 0x116ed4;
  local_80 = properties;
  local_58 = tls;
  local_48 = emitter;
  ch = (st_ptls_client_hello_t *)malloc(0x500);
  ppVar35 = local_6d8;
  uVar31 = 0x201;
  if (ch == (st_ptls_client_hello_t *)0x0) goto LAB_00117197;
  uStack_6e0 = 0x116efc;
  memset(local_6d8,0,0x500);
  uStack_6e0 = 0x116f14;
  memcpy(local_378,&DAT_00135c38,0x198);
  uStack_6e0 = 0x116f24;
  memcpy(ch,local_6d8,0x500);
  auStack_138 = (undefined1  [8])(puVar36 + 4);
  uVar31 = 0x32;
  if (5 < (long)sVar63) {
    ch->legacy_version = *(ushort *)(puVar36 + 4) << 8 | *(ushort *)(puVar36 + 4) >> 8;
    auStack_138 = (undefined1  [8])(puVar36 + 6);
    uVar31 = 0;
  }
  ppVar49 = (ptls_key_schedule_t *)(puVar36 + sVar63);
  if ((5 < (long)sVar63) && (uVar31 = 0x46, 0x300 < ch->legacy_version)) {
    uVar31 = 0x32;
    if (0x1f < (long)ppVar49 - (long)auStack_138) {
      ch->random_bytes = (uint8_t *)auStack_138;
      auVar47 = (undefined1  [8])((size_t *)((long)auStack_138 + 0x10) + 2);
      uVar31 = 0x32;
      if ((ptls_key_schedule_t *)((size_t *)((long)auStack_138 + 0x10) + 2) == ppVar49) {
LAB_00116fbf:
        auStack_138 = auVar47;
        bVar66 = false;
      }
      else {
        auVar47 = (undefined1  [8])((long)((long)auStack_138 + 0x10) + 0x11);
        uVar44 = (ulong)*(byte *)((size_t *)((long)auStack_138 + 0x10) + 2);
        if ((ulong)((long)ppVar49 - (long)auVar47) < uVar44) goto LAB_00116fbf;
        bVar66 = *(byte *)((size_t *)((long)auStack_138 + 0x10) + 2) < 0x21;
        auStack_138 = auVar47;
        if (bVar66) {
          (ch->legacy_session_id).base = (uint8_t *)auVar47;
          auStack_138 = (undefined1  [8])
                        ((long)((ptls_key_schedule_t *)auVar47)->secret + (uVar44 - 0x10));
          (ch->legacy_session_id).len = uVar44;
          uVar31 = 0;
          bVar66 = true;
        }
      }
      if (bVar66) {
        uVar31 = 0x32;
        if ((ulong)((long)ppVar49 - (long)auStack_138) < 2) {
LAB_00117013:
          bVar66 = false;
        }
        else {
          lVar38 = 0;
          uVar44 = 0;
          do {
            uVar44 = (ulong)*(byte *)((long)((long)auStack_138 + 0x10) + lVar38 + -0x10) |
                     uVar44 << 8;
            lVar38 = lVar38 + 1;
          } while (lVar38 != 2);
          ppVar35 = (ptls_key_schedule_t *)((long)(uint8_t **)auStack_138 + 2);
          auStack_138 = (undefined1  [8])ppVar35;
          if ((ulong)((long)ppVar49 - (long)ppVar35) < uVar44) goto LAB_00117013;
          ppVar39 = (ptls_key_schedule_t *)((long)ppVar35->secret + (uVar44 - 0x10));
          (ch->cipher_suites).base = (uint8_t *)ppVar35;
          (ch->cipher_suites).len = uVar44;
          uVar44 = 0x208;
          while( true ) {
            lVar38 = (long)ppVar39 - (long)ppVar35;
            uVar33 = 0x32;
            auStack_138 = (undefined1  [8])ppVar35;
            if (lVar38 < 2) break;
            *(ushort *)((long)(ch->signature_algorithms).list + (uVar44 - 0x68)) =
                 *(ushort *)&ppVar35->generation << 8 | *(ushort *)&ppVar35->generation >> 8;
            ppVar35 = (ptls_key_schedule_t *)((long)&ppVar35->generation + 2);
            uVar33 = 0;
            psVar48 = &(ch->client_ciphers).count;
            *psVar48 = *psVar48 + 1;
            auStack_138 = (undefined1  [8])ppVar39;
            if ((0x245 < uVar44) ||
               (uVar44 = uVar44 + 2, auStack_138 = (undefined1  [8])ppVar35, ppVar35 == ppVar39))
            break;
          }
          uVar31 = 0x32;
          if (auStack_138 == (undefined1  [8])ppVar39) {
            uVar31 = uVar33;
          }
          if (lVar38 < 2) {
            uVar31 = uVar33;
          }
          bVar66 = 1 < lVar38 && auStack_138 == (undefined1  [8])ppVar39;
        }
        if (bVar66) {
          uVar33 = 0x32;
          if (auStack_138 == (undefined1  [8])ppVar49) {
LAB_001170f0:
            bVar66 = false;
          }
          else {
            ppVar35 = (ptls_key_schedule_t *)((long)(uint8_t **)auStack_138 + 1);
            uVar44 = (ulong)*(byte *)(uint8_t **)auStack_138;
            auStack_138 = (undefined1  [8])ppVar35;
            if ((ulong)((long)ppVar49 - (long)ppVar35) < uVar44) goto LAB_001170f0;
            bVar66 = uVar44 != 0;
            if (bVar66) {
              (ch->compression_methods).ids = (uint8_t *)ppVar35;
              auStack_138 = (undefined1  [8])((long)ppVar35->secret + (uVar44 - 0x10));
              (ch->compression_methods).count = uVar44;
              bVar66 = true;
              uVar33 = uVar31;
            }
          }
          uVar31 = uVar33;
          if (bVar66) {
            auVar24._8_8_ = 0;
            auVar24._0_8_ = server_name.base;
            _auStack_168 = (ptls_iovec_t)(auVar24 << 0x40);
            auVar47 = auStack_138;
            if ((ulong)((long)ppVar49 - (long)auStack_138) < 2) {
LAB_0011716a:
              auStack_138 = auVar47;
              ppVar35 = (ptls_key_schedule_t *)0x0;
              uVar31 = 0x32;
              auVar47 = auStack_138;
            }
            else {
              lVar38 = 0;
              uVar44 = 0;
              do {
                uVar44 = (ulong)*(byte *)((long)((long)auStack_138 + 0x10) + lVar38 + -0x10) |
                         uVar44 << 8;
                lVar38 = lVar38 + 1;
              } while (lVar38 != 2);
              auVar47 = (undefined1  [8])((long)(uint8_t **)auStack_138 + 2);
              if ((ulong)((long)ppVar49 - (long)auVar47) < uVar44) goto LAB_0011716a;
              ppVar35 = (ptls_key_schedule_t *)(ulong)(uVar44 == 0);
              if (uVar44 != 0) {
                ppVar39 = (ptls_key_schedule_t *)((long)((long)auStack_138 + 0x10) + (uVar44 - 0xe))
                ;
                _uStack_148 = (ptls_buffer_t *)&(ch->psk).identities;
                local_b0 = &ch->signature_algorithms;
                psk_index = (size_t)&ch->alpn;
                local_1d0 = &(ch->esni).key_share;
                local_1c8 = &(ch->esni).peer_key;
                local_a0 = &ch->server_name;
                local_1d8 = ch->unknown_extensions;
                local_1c0 = &(ch->psk).identities.list[0].binder.len;
                ppVar35 = (ptls_key_schedule_t *)0x0;
                local_40 = ppVar49;
                local_70 = ppVar39;
                auStack_138 = auVar47;
                while (uVar31 = 0x32, auVar47 = auStack_138, 1 < (long)ppVar39 - (long)auStack_138)
                {
                  uVar6 = *(ushort *)(uint8_t **)auStack_138;
                  uVar54 = uVar6 << 8 | uVar6 >> 8;
                  uVar33 = (uint)uVar54;
                  auStack_138 = (undefined1  [8])((long)(uint8_t **)auStack_138 + 2);
                  if (uVar54 < 0x40) {
                    if (((byte)auStack_168[uVar54 >> 3] >> (uVar33 & 7) & 1) != 0) {
                      uVar31 = 0x2f;
                      auVar47 = auStack_138;
                      break;
                    }
                    auStack_168[uVar54 >> 3] =
                         auStack_168[uVar54 >> 3] | (byte)(1 << ((byte)(uVar6 >> 8) & 7));
                  }
                  uVar45 = 0x32;
                  if ((ulong)((long)ppVar39 - (long)auStack_138) < 2) {
LAB_001174fb:
                    bVar66 = false;
                    uVar31 = uVar45;
                    goto LAB_001174fd;
                  }
                  lVar38 = 0;
                  uVar44 = 0;
                  do {
                    uVar44 = (ulong)*(byte *)((long)((long)auStack_138 + 0x10) + lVar38 + -0x10) |
                             uVar44 << 8;
                    lVar38 = lVar38 + 1;
                  } while (lVar38 != 2);
                  auStack_138 = (undefined1  [8])((long)(uint8_t **)auStack_138 + 2);
                  uVar31 = 0;
                  if ((ulong)((long)ppVar39 - (long)auStack_138) < uVar44) goto LAB_001174fb;
                  puVar3 = &(ch->psk).field_0xb4;
                  *puVar3 = *puVar3 & 0xfd;
                  psVar9 = local_58->ctx->on_extension;
                  local_68 = ppVar35;
                  local_38 = (ptls_key_schedule_t *)CONCAT44(local_38._4_4_,uVar33);
                  uVar46 = (ulong)uVar33;
                  ppVar35 = (ptls_key_schedule_t *)auStack_138;
                  if (psVar9 != (st_ptls_on_extension_t *)0x0) {
                    uStack_6e0 = 0x11755d;
                    pVar69.len = uVar44;
                    pVar69.base = (uint8_t *)auStack_138;
                    local_78 = (ulong)uVar33;
                    local_50 = (ptls_key_schedule_t *)auStack_138;
                    iVar30 = (*psVar9->cb)(psVar9,local_58,'\x01',uVar54,pVar69);
                    bVar66 = iVar30 != 0;
                    uVar31 = (uint)bVar66;
                    uVar33 = (uint)bVar66;
                    uVar46 = local_78;
                    ppVar39 = local_70;
                    ppVar49 = local_40;
                    ppVar35 = local_50;
                    if (iVar30 == 0) goto LAB_00117594;
                    goto LAB_00117576;
                  }
LAB_00117594:
                  auVar47 = auStack_138;
                  end = (ptls_key_schedule_t *)((long)ppVar35->secret + (uVar44 - 0x10));
                  iVar30 = (int)uVar46;
                  if (iVar30 < 0x1b) {
                    if (iVar30 < 0xd) {
                      if (iVar30 != 0) {
                        if (iVar30 == 5) {
                          ch->field_0x4f8 = ch->field_0x4f8 | 1;
                        }
                        else {
                          if (iVar30 != 10) goto switchD_001175f9_caseD_2e;
                          (ch->negotiated_groups).base = (uint8_t *)auStack_138;
                          (ch->negotiated_groups).len = (long)end - (long)auStack_138;
                        }
                        goto LAB_00118493;
                      }
                      uStack_6e0 = 0x1177d4;
                      uVar33 = client_hello_decode_server_name
                                         (local_a0,(uint8_t **)auStack_138,(uint8_t *)end);
                      ppVar39 = local_70;
                      ppVar49 = local_40;
                      if (uVar33 != 0) goto LAB_00117576;
                      if (auStack_138 != (undefined1  [8])end) {
                        bVar66 = false;
                        ppVar35 = local_68;
                        uVar31 = 0x32;
                        goto LAB_001174fd;
                      }
LAB_0011814f:
                      ppVar39 = local_70;
                      ppVar49 = local_40;
                      uVar31 = 0;
                      goto LAB_00118493;
                    }
                    local_50 = end;
                    if (iVar30 == 0xd) {
                      uStack_6e0 = 0x1177fe;
                      uVar33 = decode_signature_algorithms
                                         (local_b0,(uint8_t **)auStack_138,(uint8_t *)end);
                      ppVar39 = local_70;
                      end = local_50;
                      uVar31 = 0;
                      if (uVar33 == 0) goto LAB_00118493;
                    }
                    else if (iVar30 == 0x10) {
                      if ((ulong)((long)end - (long)auStack_138) < 2) {
                        bVar66 = false;
                        uVar33 = 0x32;
                      }
                      else {
                        lVar38 = 0;
                        uVar44 = 0;
                        do {
                          uVar44 = (ulong)*(byte *)((long)((long)auStack_138 + 0x10) +
                                                   lVar38 + -0x10) | uVar44 << 8;
                          lVar38 = lVar38 + 1;
                        } while (lVar38 != 2);
                        auStack_138 = (undefined1  [8])((long)(uint8_t **)auStack_138 + 2);
                        if ((ulong)((long)end - (long)auStack_138) < uVar44) {
                          bVar66 = false;
                          uVar33 = 0x32;
                        }
                        else {
                          ppVar50 = (ptls_key_schedule_t *)
                                    ((long)((ptls_key_schedule_t *)auStack_138)->secret +
                                    (uVar44 - 0x10));
                          ppVar35 = (ptls_key_schedule_t *)auStack_138;
                          do {
                            if (ppVar50 == ppVar35) {
                              bVar66 = false;
                              ppVar40 = ppVar35;
LAB_00117d4d:
                              uVar31 = 0x32;
                            }
                            else {
                              ppVar40 = (ptls_key_schedule_t *)((long)&ppVar35->generation + 1);
                              uVar44 = (ulong)*(byte *)&ppVar35->generation;
                              auStack_138 = (undefined1  [8])ppVar40;
                              if ((ulong)((long)ppVar50 - (long)ppVar40) < uVar44) {
                                bVar66 = false;
                                goto LAB_00117d4d;
                              }
                              bVar66 = uVar44 != 0;
                              if (uVar44 == 0) goto LAB_00117d4d;
                              uVar46 = (ch->alpn).count;
                              if (uVar46 < 0x10) {
                                (ch->alpn).count = uVar46 + 1;
                                *(ptls_key_schedule_t **)(psk_index + uVar46 * 0x10) = ppVar40;
                                *(ulong *)(psk_index + 8 + uVar46 * 0x10) = uVar44;
                              }
                              ppVar40 = (ptls_key_schedule_t *)
                                        ((long)ppVar40->secret + (uVar44 - 0x10));
                              bVar66 = true;
                              auStack_138 = (undefined1  [8])ppVar40;
                            }
                            uVar33 = uVar31;
                          } while ((bVar66) && (ppVar35 = ppVar40, ppVar40 != ppVar50));
                        }
                      }
                      if (bVar66) {
                        end = local_50;
                        uVar31 = uVar33;
                        if (auStack_138 == (undefined1  [8])end) goto LAB_00118493;
                        uVar33 = 0x32;
                      }
                    }
                    else {
                      if (iVar30 != 0x14) goto switchD_001175f9_caseD_2e;
                      if ((undefined1  [8])end == auStack_138) {
LAB_00117b8a:
                        uVar33 = 0x32;
                        bVar66 = false;
                      }
                      else {
                        ppVar35 = (ptls_key_schedule_t *)((long)(uint8_t **)auStack_138 + 1);
                        ppuVar25 = (uint8_t **)auStack_138;
                        uVar44 = (ulong)*(byte *)ppuVar25;
                        auStack_138 = (undefined1  [8])ppVar35;
                        if ((ulong)((long)end - (long)ppVar35) < uVar44) goto LAB_00117b8a;
                        uVar45 = 0x32;
                        if ((uVar44 == 0) ||
                           ((uVar46 = uVar44, *(byte *)ppuVar25 == 1 &&
                            (*(uint8_t *)&ppVar35->generation == '\0')))) {
                          bVar68 = false;
                        }
                        else {
                          do {
                            uVar57 = (ch->server_certificate_types).count;
                            if (uVar57 < 8) {
                              uVar5 = *(uint8_t *)&((ptls_key_schedule_t *)auStack_138)->generation;
                              (ch->server_certificate_types).count = uVar57 + 1;
                              (ch->server_certificate_types).list[uVar57] = uVar5;
                            }
                            auStack_138 = (undefined1  [8])
                                          ((long)&((ptls_key_schedule_t *)auStack_138)->generation +
                                          1);
                            uVar46 = uVar46 - 1;
                          } while (uVar46 != 0);
                          bVar68 = true;
                          uVar45 = uVar31;
                        }
                        bVar66 = auStack_138 ==
                                 (undefined1  [8])((long)ppVar35->secret + (uVar44 - 0x10));
                        uVar33 = 0x32;
                        if (bVar66) {
                          uVar33 = uVar45;
                        }
                        if (!bVar68) {
                          uVar33 = uVar45;
                        }
                        bVar66 = (bool)(bVar66 & bVar68);
                      }
                      ppVar39 = local_70;
                      if (bVar66) {
                        end = local_50;
                        uVar31 = uVar33;
                        if (auStack_138 == (undefined1  [8])end) goto LAB_00118493;
                        uVar33 = 0x32;
                      }
                    }
                    goto LAB_00117576;
                  }
                  ppVar35 = local_68;
                  switch(iVar30) {
                  case 0x29:
                    local_78 = CONCAT44(local_78._4_4_,0x32);
                    local_50 = end;
                    if ((ulong)((long)end - (long)auStack_138) < 2) {
LAB_0011764f:
                      auStack_138 = auVar47;
                      local_a8 = (ptls_key_schedule_t *)0x0;
                      bVar66 = false;
                    }
                    else {
                      lVar38 = 0;
                      uVar44 = 0;
                      do {
                        lVar41 = uVar44 * 0x100;
                        uVar46 = (ulong)*(byte *)((long)((long)auStack_138 + 0x10) + lVar38 + -0x10)
                        ;
                        uVar44 = lVar41 + uVar46;
                        lVar38 = lVar38 + 1;
                      } while (lVar38 != 2);
                      auVar47 = (undefined1  [8])((long)(uint8_t **)auStack_138 + 2);
                      if ((ulong)((long)end - (long)auVar47) < uVar44) goto LAB_0011764f;
                      ppVar49 = (ptls_key_schedule_t *)(uVar44 + (long)auVar47);
                      local_90 = (uint8_t *)((long)auStack_138 + uVar46 + lVar41);
                      local_a8 = (ptls_key_schedule_t *)0x0;
                      local_78 = CONCAT44(local_78._4_4_,uVar31);
                      auStack_138 = auVar47;
                      do {
                        bVar66 = true;
                        uVar55 = 0x32;
                        if ((ulong)((long)ppVar49 - (long)auVar47) < 2) {
                          uVar44 = 0;
                          bVar68 = false;
                          ppVar39 = (ptls_key_schedule_t *)0x0;
                        }
                        else {
                          lVar38 = 2;
                          uVar44 = 0;
                          ppVar39 = (ptls_key_schedule_t *)auVar47;
                          do {
                            uVar46 = uVar44 * 0x100;
                            auStack_138 = (undefined1  [8])((long)&ppVar39->generation + 1);
                            ppuVar25 = (uint8_t **)&ppVar39->generation;
                            uVar44 = uVar46 + *(byte *)ppuVar25;
                            lVar38 = lVar38 + -1;
                            ppVar39 = (ptls_key_schedule_t *)auStack_138;
                          } while (lVar38 != 0);
                          bVar68 = false;
                          if ((ulong)((long)local_90 - (long)auVar47) < uVar44) {
                            uVar44 = 0;
                            auVar47 = auStack_138;
                            ppVar39 = (ptls_key_schedule_t *)0x0;
                          }
                          else {
                            auVar47 = (undefined1  [8])
                                      ((long)((ptls_key_schedule_t *)auStack_138)->secret +
                                      ((uVar46 | *(byte *)ppuVar25) - 0x10));
                            bVar68 = true;
                            bVar66 = false;
                            uVar55 = (uint)local_78;
                            auStack_138 = auVar47;
                          }
                        }
                        if (bVar68) {
                          lVar38 = (long)ppVar49 - (long)auVar47;
                          if (lVar38 < 4) {
                            local_78 = CONCAT44(local_78._4_4_,0x32);
                            uVar31 = 0;
                          }
                          else {
                            uVar31 = ((ptls_key_schedule_t *)auVar47)->generation;
                            uVar31 = uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 |
                                     (uVar31 & 0xff00) << 8 | uVar31 << 0x18;
                            auVar47 = (undefined1  [8])&((ptls_key_schedule_t *)auVar47)->field_0x4;
                            local_78 = (ulong)local_78._4_4_ << 0x20;
                            auStack_138 = auVar47;
                          }
                          bVar66 = true;
                          if (3 < lVar38) {
                            uVar46 = (ch->psk).identities.count;
                            if (uVar46 < 4) {
                              (ch->psk).identities.count = uVar46 + 1;
                              *(ptls_key_schedule_t **)((long)_uStack_148 + uVar46 * 0x28) = ppVar39
                              ;
                              *(ulong *)((long)_uStack_148 + uVar46 * 0x28 + 8) = uVar44;
                              *(uint *)((long)_uStack_148 + uVar46 * 0x28 + 0x10) = uVar31;
                              puVar4 = (undefined8 *)((long)_uStack_148 + uVar46 * 0x28 + 0x14);
                              *puVar4 = 0;
                              puVar4[1] = 0;
                              *(undefined4 *)((long)_uStack_148 + uVar46 * 0x28 + 0x24) = 0;
                            }
                            local_a8 = (ptls_key_schedule_t *)((long)&local_a8->generation + 1);
                            bVar66 = false;
                            local_78 = local_78 & 0xffffffff00000000;
                          }
                        }
                        else {
                          local_78 = CONCAT44(local_78._4_4_,uVar55);
                        }
                        bVar66 = !bVar66;
                      } while ((bVar66) && (auVar47 != (undefined1  [8])ppVar49));
                    }
                    if (bVar66) {
                      (ch->psk).hash_end = (uint8_t *)auStack_138;
                      uVar45 = 0x32;
                      if ((ulong)((long)end - (long)auStack_138) < 2) {
LAB_001176bb:
                        bVar66 = false;
                      }
                      else {
                        lVar38 = 0;
                        uVar44 = 0;
                        do {
                          uVar44 = (ulong)*(byte *)((long)((long)auStack_138 + 0x10) +
                                                   lVar38 + -0x10) | uVar44 << 8;
                          lVar38 = lVar38 + 1;
                        } while (lVar38 != 2);
                        auStack_138 = (undefined1  [8])((long)(uint8_t **)auStack_138 + 2);
                        if ((ulong)((long)end - (long)auStack_138) < uVar44) goto LAB_001176bb;
                        ppVar39 = (ptls_key_schedule_t *)
                                  ((long)((ptls_key_schedule_t *)auStack_138)->secret +
                                  (uVar44 - 0x10));
                        ppVar50 = (ptls_key_schedule_t *)0x0;
                        ppVar49 = (ptls_key_schedule_t *)auStack_138;
                        psVar48 = local_1c0;
                        do {
                          ppVar40 = ppVar49;
                          if (ppVar39 == ppVar49) {
LAB_001180a2:
                            bVar66 = false;
                            local_78 = CONCAT44(local_78._4_4_,0x32);
                          }
                          else {
                            ppVar40 = (ptls_key_schedule_t *)((long)&ppVar49->generation + 1);
                            uVar44 = (ulong)*(byte *)&ppVar49->generation;
                            auStack_138 = (undefined1  [8])ppVar40;
                            if ((ulong)((long)ppVar39 - (long)ppVar40) < uVar44) goto LAB_001180a2;
                            if (ppVar50 < (ptls_key_schedule_t *)(ch->psk).identities.count) {
                              ((ptls_iovec_t *)(psVar48 + -1))->base = (uint8_t *)ppVar40;
                              *psVar48 = uVar44;
                            }
                            ppVar40 = (ptls_key_schedule_t *)
                                      ((long)ppVar40->secret + (uVar44 - 0x10));
                            bVar66 = true;
                            auStack_138 = (undefined1  [8])ppVar40;
                          }
                          if (!bVar66) goto LAB_001180f5;
                          ppVar50 = (ptls_key_schedule_t *)((long)&ppVar50->generation + 1);
                          psVar48 = psVar48 + 5;
                          ppVar49 = ppVar40;
                        } while (ppVar40 != ppVar39);
                        bVar66 = local_a8 == ppVar50;
                        uVar55 = (uint)local_78;
                        if (!bVar66) {
                          uVar55 = 0x2f;
                        }
                        local_78 = CONCAT44(local_78._4_4_,uVar55);
LAB_001180f5:
                        uVar45 = 0x32;
                        if (auStack_138 == (undefined1  [8])ppVar39) {
                          uVar45 = (uint)local_78;
                        }
                        if (!bVar66) {
                          uVar45 = (uint)local_78;
                        }
                        bVar66 = (bool)(auStack_138 == (undefined1  [8])ppVar39 & bVar66);
                      }
                      if (bVar66) {
                        if (auStack_138 == (undefined1  [8])end) {
                          puVar3 = &(ch->psk).field_0xb4;
                          *puVar3 = *puVar3 | 2;
                          bVar66 = true;
                        }
                        else {
                          uVar45 = 0x32;
                          bVar66 = false;
                        }
                      }
                      else {
                        bVar66 = false;
                      }
                    }
                    else {
                      bVar66 = false;
                      uVar45 = (uint)local_78;
                    }
                    ppVar39 = local_70;
                    ppVar49 = local_40;
                    end = local_50;
                    uVar31 = uVar45;
                    if (!bVar66) goto LAB_001174fb;
                    break;
                  case 0x2a:
                    puVar3 = &(ch->psk).field_0xb4;
                    *puVar3 = *puVar3 | 1;
                    break;
                  case 0x2b:
                    local_50 = end;
                    uVar31 = 0x32;
                    if ((undefined1  [8])end == auStack_138) {
LAB_00117be2:
                      bVar66 = false;
                    }
                    else {
                      ppVar39 = (ptls_key_schedule_t *)((long)(uint8_t **)auStack_138 + 1);
                      ppuVar25 = (uint8_t **)auStack_138;
                      auStack_138 = (undefined1  [8])ppVar39;
                      if ((ulong)((long)end - (long)ppVar39) < (ulong)*(byte *)ppuVar25)
                      goto LAB_00117be2;
                      ppVar50 = (ptls_key_schedule_t *)
                                ((long)ppVar39->secret + ((ulong)*(byte *)ppuVar25 - 0x10));
                      lVar38 = 4;
                      do {
                        lVar41 = (long)ppVar50 - (long)ppVar39;
                        uVar33 = 0x32;
                        bVar66 = 1 < lVar41;
                        if (1 < lVar41) {
                          local_60 = (ptls_buffer_t *)
                                     CONCAT62(local_60._2_6_,
                                              *(ushort *)&ppVar39->generation << 8 |
                                              *(ushort *)&ppVar39->generation >> 8);
                          ppVar39 = (ptls_key_schedule_t *)((long)&ppVar39->generation + 2);
                          uVar33 = 0;
                          auStack_138 = (undefined1  [8])ppVar39;
                        }
                        lVar43 = lVar38;
                        if (lVar38 != 0 && 1 < lVar41) {
                          puVar56 = supported_versions;
                          lVar52 = 0;
                          do {
                            lVar43 = lVar52;
                            if (*puVar56 == (uint16_t)local_60) break;
                            lVar52 = lVar52 + 1;
                            puVar56 = puVar56 + 1;
                            lVar43 = lVar38;
                          } while (lVar38 != lVar52);
                        }
                        if (lVar41 < 2) goto LAB_001179f4;
                        lVar38 = lVar43;
                      } while (ppVar39 != ppVar50);
                      bVar66 = true;
                      if (lVar43 != 4) {
                        ch->selected_version = supported_versions[lVar43];
                      }
LAB_001179f4:
                      uVar31 = 0x32;
                      if (auStack_138 == (undefined1  [8])ppVar50) {
                        uVar31 = uVar33;
                      }
                      if (!bVar66) {
                        uVar31 = uVar33;
                      }
                      bVar66 = (bool)(auStack_138 == (undefined1  [8])ppVar50 & bVar66);
                    }
                    if (bVar66) {
                      ppVar39 = local_70;
                      end = local_50;
                      if (auStack_138 != (undefined1  [8])end) {
                        uVar33 = 0x32;
                        goto LAB_00117576;
                      }
                      break;
                    }
                    bVar66 = false;
                    ppVar39 = local_70;
                    goto LAB_001174fd;
                  case 0x2c:
                    uVar33 = 0x2f;
                    uVar45 = 0x2f;
                    if (local_80 == (st_ptls_handshake_properties_t *)0x0) goto LAB_001174fb;
                    ppVar39 = local_70;
                    ppVar49 = local_40;
                    if ((local_80->field_0).server.cookie.key == (void *)0x0) goto LAB_00117576;
                    local_50 = end;
                    (ch->cookie).all.base = (uint8_t *)auStack_138;
                    (ch->cookie).all.len = (long)end - (long)auStack_138;
                    local_78 = CONCAT44(local_78._4_4_,0x32);
                    auVar58 = auStack_138;
                    if ((ulong)((long)end - (long)auStack_138) < 2) {
LAB_00117ab8:
                      auStack_138 = auVar58;
                      bVar66 = false;
                    }
                    else {
                      lVar38 = 0;
                      uVar44 = 0;
                      do {
                        uVar46 = uVar44 * 0x100;
                        uVar57 = (ulong)*(byte *)((long)((long)auStack_138 + 0x10) + lVar38 + -0x10)
                        ;
                        uVar44 = uVar46 + uVar57;
                        lVar38 = lVar38 + 1;
                      } while (lVar38 != 2);
                      local_a8 = (ptls_key_schedule_t *)((long)(uint8_t **)auStack_138 + 2);
                      auVar58 = (undefined1  [8])local_a8;
                      if ((ulong)((long)end - (long)local_a8) < uVar44) goto LAB_00117ab8;
                      (ch->cookie).tbs.base = (uint8_t *)local_a8;
                      local_78 = CONCAT44(local_78._4_4_,0x32);
                      local_90 = (uint8_t *)CONCAT44(local_90._4_4_,2);
                      if (1 < uVar44) {
                        lVar38 = 0;
                        uVar53 = 0;
                        do {
                          uVar59 = uVar53 * 0x100;
                          uVar64 = (ulong)*(byte *)((long)((long)auStack_138 + 0x10) + lVar38 + -0xe
                                                   );
                          uVar53 = uVar59 + uVar64;
                          lVar38 = lVar38 + 1;
                        } while (lVar38 != 2);
                        auVar58 = (undefined1  [8])((long)auStack_138 + 4);
                        if (uVar53 <= (uVar46 | uVar57) - 2) {
                          local_b4 = 0x32;
                          local_90 = (uint8_t *)CONCAT44(local_90._4_4_,2);
                          if (uVar53 == 0) {
                            bVar66 = false;
                          }
                          else {
                            auVar58 = (undefined1  [8])((long)auStack_138 + 5);
                            puVar51 = (uint8_t *)(ulong)(byte)*(undefined1 *)((long)auStack_138 + 4)
                            ;
                            bVar66 = false;
                            if (puVar51 <=
                                (uint8_t *)
                                ((long)auStack_138 + ((uVar59 | uVar64) - (long)auVar58) + 4)) {
                              (ch->cookie).ch1_hash.base = (uint8_t *)auVar58;
                              (ch->cookie).ch1_hash.len = (size_t)puVar51;
                              bVar66 = true;
                              local_90 = (uint8_t *)((ulong)local_90._4_4_ << 0x20);
                              local_b4 = uVar31;
                              auVar58 = (undefined1  [8])
                                        ((long)((long)auStack_138 + 0x10) + (long)(puVar51 + -0xb));
                            }
                          }
                          auStack_138 = auVar58;
                          auVar58 = auStack_138;
                          if (bVar66) {
                            ppVar49 = (ptls_key_schedule_t *)((long)auVar47 + uVar53 + 4);
                            local_78 = CONCAT44(local_78._4_4_,0x32);
                            local_90 = (uint8_t *)CONCAT44(local_90._4_4_,2);
                            if ((undefined1  [8])ppVar49 != auStack_138) {
                              auVar58 = (undefined1  [8])((long)(uint8_t **)auStack_138 + 1);
                              if (*(uint8_t *)(uint8_t **)auStack_138 == '\x01') {
                                puVar3 = &(ch->cookie).field_0x40;
                                *puVar3 = *puVar3 | 1;
                              }
                              else {
                                if (*(uint8_t *)(uint8_t **)auStack_138 != '\0') goto LAB_001184f8;
                                if (((ch->cookie).field_0x40 & 1) != 0) {
                                  uStack_6e0 = 0x11bcfc;
                                  auStack_138 = auVar58;
                                  __assert_fail("!ch->cookie.sent_key_share",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                                                ,0xd47,
                                                "int decode_client_hello(ptls_t *, struct st_ptls_client_hello_t *, const uint8_t *, const uint8_t *const, ptls_handshake_properties_t *)"
                                               );
                                }
                              }
                              uVar31 = local_b4;
                              if ((undefined1  [8])ppVar49 != auVar58) {
                                uVar31 = 0x32;
                              }
                              local_90 = (uint8_t *)
                                         CONCAT44(local_90._4_4_,
                                                  (uint)((undefined1  [8])ppVar49 != auVar58) * 2);
                              local_78 = CONCAT44(local_78._4_4_,uVar31);
                            }
                          }
                          else {
                            local_78 = CONCAT44(local_78._4_4_,local_b4);
                          }
                        }
                      }
LAB_001184f8:
                      auStack_138 = auVar58;
                      if ((int)local_90 == 0) {
                        ppVar49 = (ptls_key_schedule_t *)(uVar44 + (long)local_a8);
                        (ch->cookie).tbs.len = (long)auStack_138 - (long)local_a8;
                        uVar55 = 0x32;
                        local_90 = (uint8_t *)CONCAT44(local_90._4_4_,2);
                        if ((undefined1  [8])ppVar49 == auStack_138) {
                          bVar66 = false;
                        }
                        else {
                          ppVar39 = (ptls_key_schedule_t *)((long)(uint8_t **)auStack_138 + 1);
                          uVar44 = (ulong)*(byte *)(uint8_t **)auStack_138;
                          bVar66 = false;
                          auStack_138 = (undefined1  [8])ppVar39;
                          if (uVar44 <= (ulong)((long)ppVar49 - (long)ppVar39)) {
                            (ch->cookie).signature.base = (uint8_t *)ppVar39;
                            auStack_138 = (undefined1  [8])((long)ppVar39->secret + (uVar44 - 0x10))
                            ;
                            (ch->cookie).signature.len = uVar44;
                            bVar66 = true;
                            local_90 = (uint8_t *)((ulong)local_90._4_4_ << 0x20);
                            uVar55 = (undefined4)local_78;
                          }
                        }
                        if (bVar66) {
                          if (auStack_138 != (undefined1  [8])ppVar49) {
                            uVar55 = 0x32;
                          }
                          local_90 = (uint8_t *)
                                     CONCAT44(local_90._4_4_,
                                              (uint)(auStack_138 != (undefined1  [8])ppVar49) * 2);
                        }
                        local_78 = CONCAT44(local_78._4_4_,uVar55);
                      }
                      bVar66 = (int)local_90 == 0;
                    }
                    uVar31 = (uint)local_78;
                    if (!bVar66) {
                      bVar66 = false;
                      ppVar39 = local_70;
                      ppVar49 = local_40;
                      goto LAB_001174fd;
                    }
                    ppVar39 = local_70;
                    ppVar49 = local_40;
                    end = local_50;
                    if (auStack_138 != (undefined1  [8])end) {
                      uVar33 = 0x32;
                      goto LAB_00117576;
                    }
                    break;
                  case 0x2d:
                    local_78 = CONCAT44(local_78._4_4_,uVar31);
                    uVar33 = 0x32;
                    if ((undefined1  [8])end == auStack_138) {
LAB_00117bb3:
                      bVar66 = false;
                    }
                    else {
                      ppVar35 = (ptls_key_schedule_t *)((long)(uint8_t **)auStack_138 + 1);
                      uVar44 = (ulong)*(byte *)(uint8_t **)auStack_138;
                      auStack_138 = (undefined1  [8])ppVar35;
                      if ((ulong)((long)end - (long)ppVar35) < uVar44) goto LAB_00117bb3;
                      bVar66 = uVar44 != 0;
                      if (bVar66) {
                        do {
                          if (*(byte *)&ppVar35->generation < 0x20) {
                            puVar2 = &(ch->psk).ke_modes;
                            *puVar2 = *puVar2 | 1 << (*(byte *)&ppVar35->generation & 0x1f);
                          }
                          ppVar35 = (ptls_key_schedule_t *)((long)&ppVar35->generation + 1);
                          uVar44 = uVar44 - 1;
                        } while (uVar44 != 0);
                        bVar66 = true;
                        auStack_138 = (undefined1  [8])ppVar35;
                        uVar33 = uVar31;
                      }
                    }
                    if (bVar66) {
                      uVar31 = uVar33;
                      if (auStack_138 == (undefined1  [8])end) break;
                      uVar33 = 0x32;
                    }
                    goto LAB_00117576;
                  case 0x2e:
                  case 0x2f:
                  case 0x30:
                  case 0x31:
                  case 0x32:
switchD_001175f9_caseD_2e:
                    if (local_80 != (st_ptls_handshake_properties_t *)0x0) {
                      local_78 = CONCAT44(local_78._4_4_,uVar31);
                      local_50 = end;
                      if (local_80->collect_extension !=
                          (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0) {
                        uStack_6e0 = 0x117874;
                        iVar30 = (*local_80->collect_extension)(local_58,local_80,(uint16_t)uVar46);
                        if (iVar30 != 0) {
                          uStack_6e0 = 0x117896;
                          uVar33 = collect_unknown_extension
                                             ((ptls_t *)(uVar46 & 0xffffffff),auStack_138._0_2_,
                                              (uint8_t *)local_50,(uint8_t *)local_1d8,
                                              (ptls_raw_extension_t *)ppVar39);
                          ppVar39 = local_70;
                          ppVar49 = local_40;
                          end = local_50;
                          if (uVar33 != 0) goto LAB_00117576;
                          goto LAB_0011814f;
                        }
                      }
                      ppVar39 = local_70;
                      ppVar49 = local_40;
                      end = local_50;
                      uVar31 = (uint)local_78;
                    }
                    break;
                  case 0x33:
                    (ch->key_shares).base = (uint8_t *)auStack_138;
                    (ch->key_shares).len = (long)end - (long)auStack_138;
                    break;
                  default:
                    if (iVar30 != 0x1b) {
                      if (iVar30 != 0xffce) goto switchD_001175f9_caseD_2e;
                      local_50 = end;
                      if ((ch->esni).cipher == (ptls_cipher_suite_t *)0x0) {
                        lVar38 = (long)end - (long)auStack_138;
                        uVar31 = 0x32;
                        if (1 < lVar38) {
                          local_92 = *(ushort *)(uint8_t **)auStack_138 << 8 |
                                     *(ushort *)(uint8_t **)auStack_138 >> 8;
                          auStack_138 = (undefined1  [8])((long)(uint8_t **)auStack_138 + 2);
                          uVar31 = 0;
                        }
                        bVar66 = true;
                        if (lVar38 < 2) {
                          bVar68 = false;
                        }
                        else {
                          local_140 = local_58->ctx->cipher_suites;
                          uVar31 = 0x2f;
                          bVar68 = *local_140 != (ptls_cipher_suite_t *)0x0;
                          if (bVar68) {
                            uVar6 = (*local_140)->id;
                            while (uVar6 != local_92) {
                              local_140 = local_140 + 1;
                              ppVar7 = *local_140;
                              bVar68 = ppVar7 != (ptls_cipher_suite_t *)0x0;
                              if (ppVar7 == (ptls_cipher_suite_t *)0x0) goto LAB_00118013;
                              uVar6 = ppVar7->id;
                            }
                            bVar66 = false;
                            uVar31 = 0;
                          }
                        }
LAB_00118013:
                        if (bVar68) {
                          uStack_6e0 = 0x11804a;
                          uVar31 = select_key_share(local_1d0,local_1c8,local_58->ctx->key_exchanges
                                                    ,(uint8_t **)auStack_138,(uint8_t *)end,1);
                          if (uVar31 != 0) goto LAB_001177b1;
                          uVar31 = 0x32;
                          bVar66 = true;
                          if (1 < (ulong)((long)local_50 - (long)auStack_138)) {
                            lVar38 = 0;
                            uVar44 = 0;
                            do {
                              uVar44 = (ulong)*(byte *)((long)((long)auStack_138 + 0x10) +
                                                       lVar38 + -0x10) | uVar44 << 8;
                              lVar38 = lVar38 + 1;
                            } while (lVar38 != 2);
                            auStack_138 = (undefined1  [8])((long)(uint8_t **)auStack_138 + 2);
                            if (uVar44 <= (ulong)((long)local_50 - (long)auStack_138)) {
                              ppVar35 = (ptls_key_schedule_t *)
                                        ((long)((ptls_key_schedule_t *)auStack_138)->secret +
                                        (uVar44 - 0x10));
                              uVar46 = (*local_140)->hash->digest_size;
                              if (uVar44 != uVar46) {
                                uVar33 = 0x2f;
                              }
                              else {
                                (ch->esni).record_digest = (uint8_t *)auStack_138;
                                uVar33 = 0;
                                auStack_138 = (undefined1  [8])ppVar35;
                              }
                              uVar31 = 0x32;
                              if (auStack_138 == (undefined1  [8])ppVar35) {
                                uVar31 = uVar33;
                              }
                              bVar66 = auStack_138 != (undefined1  [8])ppVar35;
                              if (uVar44 != uVar46) {
                                uVar31 = uVar33;
                                bVar66 = uVar44 != uVar46;
                              }
                            }
                          }
                          if (!bVar66) {
                            uVar33 = 0x32;
                            bVar66 = true;
                            if (1 < (ulong)((long)local_50 - (long)auStack_138)) {
                              lVar38 = 0;
                              uVar44 = 0;
                              do {
                                uVar44 = (ulong)*(byte *)((long)((long)auStack_138 + 0x10) +
                                                         lVar38 + -0x10) | uVar44 << 8;
                                lVar38 = lVar38 + 1;
                              } while (lVar38 != 2);
                              auStack_138 = (undefined1  [8])((long)(uint8_t **)auStack_138 + 2);
                              if (uVar44 <= (ulong)((long)local_50 - (long)auStack_138)) {
                                ppVar35 = (ptls_key_schedule_t *)
                                          ((long)((ptls_key_schedule_t *)auStack_138)->secret +
                                          (uVar44 - 0x10));
                                uVar46 = (*local_140)->aead->tag_size;
                                if (uVar46 <= uVar44) {
                                  (ch->esni).encrypted_sni.base = (uint8_t *)auStack_138;
                                  (ch->esni).encrypted_sni.len = uVar44;
                                  auStack_138 = (undefined1  [8])ppVar35;
                                }
                                else {
                                  uVar31 = 0x2f;
                                }
                                uVar33 = 0x32;
                                if (auStack_138 == (undefined1  [8])ppVar35) {
                                  uVar33 = uVar31;
                                }
                                bVar66 = auStack_138 != (undefined1  [8])ppVar35;
                                if (uVar44 < uVar46) {
                                  uVar33 = uVar31;
                                  bVar66 = uVar46 > uVar44;
                                }
                              }
                            }
                            uVar31 = uVar33;
                            if (!bVar66) {
                              if (auStack_138 != (undefined1  [8])local_50) {
                                uVar31 = 0x32;
                                goto LAB_001177b1;
                              }
                              (ch->esni).cipher = *local_140;
                              bVar66 = false;
                            }
                          }
                        }
                      }
                      else {
                        uVar31 = 0x2f;
LAB_001177b1:
                        bVar66 = true;
                      }
                      ppVar39 = local_70;
                      end = local_50;
                      if (!bVar66) break;
                      bVar66 = false;
                      ppVar35 = local_68;
                      goto LAB_001174fd;
                    }
                    uVar33 = 0x32;
                    if ((undefined1  [8])end == auStack_138) {
LAB_00117aed:
                      bVar66 = false;
                    }
                    else {
                      ppVar35 = (ptls_key_schedule_t *)((long)(uint8_t **)auStack_138 + 1);
                      ppuVar25 = (uint8_t **)auStack_138;
                      auStack_138 = (undefined1  [8])ppVar35;
                      if ((ulong)((long)end - (long)ppVar35) < (ulong)*(byte *)ppuVar25)
                      goto LAB_00117aed;
                      ppVar39 = (ptls_key_schedule_t *)
                                ((long)ppVar35->secret + ((ulong)*(byte *)ppuVar25 - 0x10));
                      do {
                        lVar38 = (long)ppVar39 - (long)ppVar35;
                        uVar33 = 0x32;
                        if (1 < lVar38) {
                          local_b6 = *(ushort *)&ppVar35->generation << 8 |
                                     *(ushort *)&ppVar35->generation >> 8;
                          ppVar35 = (ptls_key_schedule_t *)((long)&ppVar35->generation + 2);
                          uVar33 = 0;
                          auStack_138 = (undefined1  [8])ppVar35;
                        }
                        bVar66 = true;
                        if (1 < lVar38) {
                          uVar44 = (ch->cert_compression_algos).count;
                          bVar66 = false;
                          if (uVar44 < 0x10) {
                            (ch->cert_compression_algos).count = uVar44 + 1;
                            (ch->cert_compression_algos).list[uVar44] = local_b6;
                            bVar66 = false;
                          }
                        }
                        if (lVar38 < 2) goto LAB_00117df5;
                      } while (ppVar35 != ppVar39);
                      bVar66 = false;
LAB_00117df5:
                      bVar66 = !bVar66;
                    }
                    ppVar39 = local_70;
                    if (bVar66) {
                      uVar31 = uVar33;
                      if (auStack_138 == (undefined1  [8])end) break;
                      uVar33 = 0x32;
                    }
LAB_00117576:
                    bVar66 = false;
                    ppVar35 = local_68;
                    uVar31 = uVar33;
                    goto LAB_001174fd;
                  }
LAB_00118493:
                  bVar66 = true;
                  ppVar35 = local_68;
                  auStack_138 = (undefined1  [8])end;
LAB_001174fd:
                  auVar47 = auStack_138;
                  if ((!bVar66) ||
                     (ppVar35 = (ptls_key_schedule_t *)
                                CONCAT71((int7)((ulong)ppVar35 >> 8),
                                         auStack_138 == (undefined1  [8])ppVar39),
                     auStack_138 == (undefined1  [8])ppVar39)) break;
                }
              }
            }
            auStack_138 = auVar47;
            if ((((ulong)ppVar35 & 1) != 0) &&
               (uVar31 = 0x32, auStack_138 == (undefined1  [8])ppVar49)) {
              uVar31 = 0;
            }
          }
        }
      }
    }
  }
  ppVar28 = local_58;
  ppVar35 = local_6d8;
  if (uVar31 != 0) goto LAB_00117197;
  lVar38 = 0;
  do {
    puVar56 = (uint16_t *)((long)supported_versions + lVar38);
    if (*puVar56 == ch->selected_version) break;
    bVar66 = lVar38 != 6;
    lVar38 = lVar38 + 2;
  } while (bVar66);
  if (*puVar56 != ch->selected_version) {
    if ((eVar32 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) &&
       (local_58->ctx->on_client_hello != (ptls_on_client_hello_t *)0x0)) {
      auStack_138 = (undefined1  [8])(ch->server_name).base;
      cs = (ptls_cipher_suite_t *)(ch->server_name).len;
      local_118 = (ch->alpn).list;
      local_110 = (ch->alpn).count;
      _local_108 = ZEXT832(0) << 0x20;
      local_c8 = local_c8 & 0xfc | 2;
      psVar10 = local_58->ctx->on_client_hello;
      uStack_6e0 = 0x1172f0;
      local_128 = puVar36;
      local_120 = sVar63;
      _local_e8 = _local_108;
      uVar31 = (*psVar10->cb)(psVar10,local_58,(ptls_on_client_hello_parameters_t *)auStack_138);
      ppVar35 = local_6d8;
      if (uVar31 != 0) goto LAB_00117197;
    }
    ppVar35 = local_6d8;
    uVar31 = 0x46;
    goto LAB_00117197;
  }
  local_88 = (ptls_key_schedule_t *)CONCAT44(local_88._4_4_,(uint)(byte)local_88);
  ppVar35 = local_6d8;
  uVar31 = 0x46;
  if ((((ch->legacy_version < 0x301) ||
       (uVar31 = 0x2f, ppVar35 = local_6d8, (ch->compression_methods).count != 1)) ||
      (ppVar35 = local_6d8, *(ch->compression_methods).ids != '\0')) ||
     ((ppVar7 = (ch->esni).cipher, ppVar7 != (ptls_cipher_suite_t *)0x0 &&
      (ppVar35 = local_6d8, (ch->key_shares).base == (uint8_t *)0x0)))) goto LAB_00117197;
  bVar37 = (ch->psk).field_0xb4;
  if ((ch->psk).hash_end == (uint8_t *)0x0) {
    ppVar35 = local_6d8;
    if ((bVar37 & 1) != 0) goto LAB_00117197;
  }
  else {
    ppVar35 = local_6d8;
    if ((bVar37 & 2) == 0) goto LAB_00117197;
  }
  ctx = local_58->ctx;
  if ((ctx->field_0x70 & 1) != 0) {
    puVar2 = &(ch->psk).ke_modes;
    *(byte *)puVar2 = (byte)*puVar2 & 0xfe;
  }
  local_40 = ppVar49;
  if (eVar32 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    ppVar35 = local_6d8;
    uVar31 = 0x32;
    if (((ch->psk).field_0xb4 & 1) != 0) goto LAB_00117197;
    uStack_6e0 = 0x117362;
    iVar30 = (*ptls_mem_equal)(local_58->client_random,ch->random_bytes,0x20);
    if (iVar30 == 0) {
      ppVar35 = local_6d8;
      uVar31 = 0x28;
      goto LAB_00117197;
    }
    pcVar8 = ppVar28->server_name;
    if (pcVar8 != (char *)0x0) {
      uStack_6e0 = 0x117382;
      sVar34 = strlen(pcVar8);
      if ((ch->server_name).len == sVar34) {
        uStack_6e0 = 0x1173a1;
        iVar30 = bcmp((ch->server_name).base,pcVar8,sVar34);
        uVar67 = iVar30 == 0;
        uVar31 = 0x28;
        if ((bool)uVar67) {
          uVar31 = 0;
        }
      }
      else {
        uVar31 = 0x28;
        uVar67 = false;
      }
      goto joined_r0x00118811;
    }
  }
  else {
    puVar51 = ch->random_bytes;
    uVar21 = *(undefined8 *)(puVar51 + 8);
    uVar22 = *(undefined8 *)(puVar51 + 0x10);
    uVar23 = *(undefined8 *)(puVar51 + 0x18);
    *(undefined8 *)local_58->client_random = *(undefined8 *)puVar51;
    *(undefined8 *)(local_58->client_random + 8) = uVar21;
    *(undefined8 *)(local_58->client_random + 0x10) = uVar22;
    *(undefined8 *)(local_58->client_random + 0x18) = uVar23;
    if ((ch->legacy_session_id).len != 0) {
      local_58->field_0x160 = local_58->field_0x160 | 4;
    }
    _auStack_168 = (ptls_iovec_t)(ZEXT816(0) << 0x20);
    if ((ppVar7 == (ptls_cipher_suite_t *)0x0) || (ctx->esni == (ptls_esni_context_t **)0x0)) {
      bVar66 = true;
      if ((ch->server_name).base != (uint8_t *)0x0) {
        _auStack_168 = ch->server_name;
      }
      bVar37 = 0;
LAB_00118671:
      if (local_58->ctx->on_client_hello == (ptls_on_client_hello_t *)0x0) {
        uVar31 = 0;
      }
      else {
        auStack_138 = auStack_168;
        cs = (ptls_cipher_suite_t *)server_name.base;
        local_118 = (ch->alpn).list;
        local_110 = (ch->alpn).count;
        sStack_100 = (ch->signature_algorithms).count;
        local_108 = &ch->signature_algorithms;
        paStack_f8 = &ch->cert_compression_algos;
        sStack_f0 = (ch->cert_compression_algos).count;
        local_e8._8_8_ = (ch->client_ciphers).count;
        local_e8._0_8_ = &ch->client_ciphers;
        local_e8._16_8_ = &ch->server_certificate_types;
        sStack_d0 = (ch->server_certificate_types).count;
        local_c8 = local_c8 & 0xfc | bVar37;
        psVar10 = local_58->ctx->on_client_hello;
        uStack_6e0 = 0x118721;
        local_128 = puVar36;
        local_120 = sVar63;
        uVar31 = (*psVar10->cb)(psVar10,local_58,(ptls_on_client_hello_parameters_t *)auStack_138);
      }
      if (!bVar66) {
        uStack_6e0 = 0x11873f;
        free((void *)auStack_168);
      }
      if (uVar31 != 0) goto LAB_00118744;
      uVar44 = (ch->server_certificate_types).count;
      bVar37 = (byte)local_58->ctx->field_0x70 >> 4 & 2;
      if ((uVar44 == 0) && (bVar37 == 0)) {
        bVar66 = false;
      }
      else {
        bVar66 = uVar44 != 0;
        if ((bVar66) && ((ch->server_certificate_types).list[0] != bVar37)) {
          lVar38 = 0;
          do {
            lVar41 = lVar38;
            if (uVar44 - 1 == lVar41) break;
            lVar38 = lVar41 + 1;
          } while ((ch->server_certificate_types).list[lVar41 + 1] != bVar37);
          bVar66 = lVar41 + 1U < uVar44;
        }
        bVar66 = (bool)(bVar66 ^ 1);
      }
      uVar31 = 0x2b;
      if (!bVar66) {
        uVar31 = 0;
      }
      uVar67 = bVar66 ^ 1;
    }
    else {
      uStack_6e0 = 0x11863f;
      uVar31 = client_hello_decrypt_esni(ctx,(ptls_iovec_t *)auStack_168,&local_58->esni,ch);
      if (uVar31 == 0) {
        psVar11 = local_58->ctx->update_esni_key;
        bVar37 = 1;
        if (psVar11 == (st_ptls_update_esni_key_t *)0x0) {
          bVar66 = false;
        }
        else {
          uStack_6e0 = 0x1187b6;
          uVar31 = (*psVar11->cb)(psVar11,local_58,local_58->esni->secret,((ch->esni).cipher)->hash,
                                  local_58->esni->esni_contents_hash);
          bVar37 = 1;
          bVar66 = false;
          uVar67 = false;
          if (uVar31 != 0) goto joined_r0x00118811;
        }
        goto LAB_00118671;
      }
LAB_00118744:
      uVar67 = false;
    }
joined_r0x00118811:
    ppVar35 = local_6d8;
    if (!(bool)uVar67) goto LAB_00117197;
  }
  puVar51 = (ch->cipher_suites).base;
  uStack_6e0 = 0x118848;
  uVar31 = select_cipher((ptls_cipher_suite_t **)auStack_138,local_58->ctx->cipher_suites,puVar51,
                         puVar51 + (ch->cipher_suites).len,
                         *(uint *)&local_58->ctx->field_0x70 >> 6 & 1);
  ppVar28 = local_58;
  if (uVar31 == 0) {
    if (eVar32 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
      if ((undefined1  [8])local_58->cipher_suite != auStack_138) {
        uVar31 = 0x28;
        goto LAB_0011884f;
      }
    }
    else {
      local_58->cipher_suite = (ptls_cipher_suite_t *)auStack_138;
      uStack_6e0 = 0x118895;
      ppVar35 = key_schedule_new((ptls_cipher_suite_t *)auStack_138,(ptls_cipher_suite_t **)0x0,
                                 local_58->ctx->hkdf_label_prefix__obsolete);
      ppVar28->key_schedule = ppVar35;
    }
    uVar31 = 0;
    bVar66 = true;
  }
  else {
LAB_0011884f:
    bVar66 = false;
  }
  ppVar35 = local_6d8;
  if (!bVar66) goto LAB_00117197;
  if ((ecdh_secret.len == 0) &&
     (ppVar35 = (ptls_key_schedule_t *)(ch->key_shares).base, ppVar35 != (ptls_key_schedule_t *)0x0)
     ) {
    uVar44 = (ch->key_shares).len;
    ppVar49 = (ptls_key_schedule_t *)((long)ppVar35->secret + (uVar44 - 0x10));
    if (uVar44 < 2) {
      bVar66 = false;
      uVar31 = 0x32;
      auStack_138 = (undefined1  [8])ppVar35;
    }
    else {
      lVar38 = 0;
      uVar44 = 0;
      do {
        uVar44 = (ulong)*(byte *)((long)ppVar35->secret + lVar38 + -0x10) | uVar44 << 8;
        lVar38 = lVar38 + 1;
      } while (lVar38 != 2);
      auStack_138 = (undefined1  [8])((long)&ppVar35->generation + 2);
      bVar66 = false;
      uVar31 = 0x32;
      if (uVar44 <= (ulong)((long)ppVar49 - (long)auStack_138)) {
        local_68 = (ptls_key_schedule_t *)
                   ((long)((ptls_key_schedule_t *)auStack_138)->secret + (uVar44 - 0x10));
        uStack_6e0 = 0x118d4f;
        local_38 = ppVar49;
        uVar33 = select_key_share((ptls_key_exchange_algorithm_t **)&ecdh_secret.len,
                                  (ptls_iovec_t *)&key_share,local_58->ctx->key_exchanges,
                                  (uint8_t **)auStack_138,(uint8_t *)local_68,0);
        uVar31 = 0x32;
        if (auStack_138 == (undefined1  [8])local_68) {
          uVar31 = 0;
        }
        if (uVar33 != 0) {
          uVar31 = uVar33;
        }
        bVar66 = uVar33 == 0 && auStack_138 == (undefined1  [8])local_68;
        ppVar49 = local_38;
      }
    }
    uVar33 = 0x32;
    if (auStack_138 == (undefined1  [8])ppVar49) {
      uVar33 = uVar31;
    }
    ppVar35 = local_6d8;
    if ((!bVar66) || (ppVar35 = local_6d8, uVar31 = uVar33, auStack_138 != (undefined1  [8])ppVar49)
       ) goto LAB_00117197;
  }
  ppVar28 = local_58;
  ppVar61 = local_80;
  sVar65 = ecdh_secret.len;
  if (eVar32 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    if (ecdh_secret.len == 0 || (ch->cookie).all.len == 0) {
      if ((ecdh_secret.len == 0) ||
         ((sig = local_6d8, local_80 != (ptls_handshake_properties_t *)0x0 &&
          (sig = local_6d8, (*(byte *)((long)&local_80->field_0 + 0x60) & 1) != 0)))) {
        local_50 = (ptls_key_schedule_t *)ecdh_secret.len;
        puVar51 = (ch->negotiated_groups).base;
        if (puVar51 == (uint8_t *)0x0) {
          ppVar35 = local_6d8;
          uVar31 = 0x6d;
          local_50 = (ptls_key_schedule_t *)ecdh_secret.len;
          goto LAB_00117197;
        }
        uStack_6e0 = 0x118ba7;
        uVar31 = select_negotiated_group
                           ((ptls_key_exchange_algorithm_t **)auStack_138,
                            local_58->ctx->key_exchanges,puVar51,
                            puVar51 + (ch->negotiated_groups).len);
        if (uVar31 == 0) {
          local_88 = local_58->key_schedule;
          if (local_88->num_hashes != 0) {
            pppVar62 = &local_88->hashes[0].ctx;
            sVar65 = 0;
            do {
              uStack_6e0 = 0x118f98;
              (*(*pppVar62)->update)(*pppVar62,puVar36,sVar63);
              sVar65 = sVar65 + 1;
              pppVar62 = pppVar62 + 2;
            } while (sVar65 != local_88->num_hashes);
          }
          if (local_58->key_schedule->generation != 0) {
            uStack_6e0 = 0x11b408;
            __assert_fail("tls->key_schedule->generation == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                          ,0xf33,
                          "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                         );
          }
          if ((local_80 == (ptls_handshake_properties_t *)0x0) ||
             ((*(byte *)((long)&local_80->field_0 + 0x60) & 2) == 0)) {
            uStack_6e0 = 0x118fd4;
            key_schedule_transform_post_ch1hash(local_58->key_schedule);
            uStack_6e0 = 0x118fe5;
            key_schedule_extract(local_58->key_schedule,(ptls_iovec_t)ZEXT816(0));
            uStack_6e0 = 0x118fec;
            uVar31 = (*local_48->begin_message)(local_48);
            if (uVar31 == 0) {
              ppVar42 = local_48->buf;
              local_88 = local_58->key_schedule;
              local_40 = (ptls_key_schedule_t *)ppVar42->off;
              uStack_6e0 = 0x119141;
              uVar31 = ptls_buffer_reserve(ppVar42,1);
              if (uVar31 == 0) {
                ppVar42->base[ppVar42->off] = '\x02';
                ppVar42->off = ppVar42->off + 1;
                uVar31 = 0;
              }
              bVar66 = true;
              if (uVar31 == 0) {
                uStack_6e0 = 0x119177;
                uVar31 = ptls_buffer_reserve(ppVar42,3);
                if (uVar31 == 0) {
                  puVar36 = ppVar42->base;
                  sVar63 = ppVar42->off;
                  puVar36[sVar63 + 2] = '\0';
                  puVar36 = puVar36 + sVar63;
                  puVar36[0] = '\0';
                  puVar36[1] = '\0';
                  ppVar42->off = ppVar42->off + 3;
                  uVar31 = 0;
                }
                bVar66 = true;
                if (uVar31 == 0) {
                  local_80 = (ptls_handshake_properties_t *)ppVar42->off;
                  ppVar20 = local_48->buf;
                  uStack_6e0 = 0x1191c4;
                  uVar31 = ptls_buffer_reserve(ppVar20,2);
                  if (uVar31 == 0) {
                    puVar36 = ppVar20->base;
                    sVar63 = ppVar20->off;
                    (puVar36 + sVar63)[0] = '\x03';
                    (puVar36 + sVar63)[1] = '\x03';
                    ppVar20->off = ppVar20->off + 2;
                    uVar31 = 0;
                  }
                  bVar66 = uVar31 != 0;
                  if (uVar31 == 0) {
                    uStack_6e0 = 0x1193e1;
                    uVar31 = ptls_buffer_reserve(local_48->buf,0x20);
                    bVar66 = true;
                    if (uVar31 == 0) {
                      puVar36 = local_48->buf->base + local_48->buf->off;
                      puVar36[0] = 0xcf;
                      puVar36[1] = '!';
                      puVar36[2] = 0xad;
                      puVar36[3] = 't';
                      puVar36[4] = 0xe5;
                      puVar36[5] = 0x9a;
                      puVar36[6] = 'a';
                      puVar36[7] = '\x11';
                      puVar36[8] = 0xbe;
                      puVar36[9] = '\x1d';
                      puVar36[10] = 0x8c;
                      puVar36[0xb] = '\x02';
                      puVar36[0xc] = '\x1e';
                      puVar36[0xd] = 'e';
                      puVar36[0xe] = 0xb8;
                      puVar36[0xf] = 0x91;
                      puVar36[0x10] = 0xc2;
                      puVar36[0x11] = 0xa2;
                      puVar36[0x12] = '\x11';
                      puVar36[0x13] = '\x16';
                      puVar36[0x14] = 'z';
                      puVar36[0x15] = 0xbb;
                      puVar36[0x16] = 0x8c;
                      puVar36[0x17] = '^';
                      puVar36[0x18] = '\a';
                      puVar36[0x19] = 0x9e;
                      puVar36[0x1a] = '\t';
                      puVar36[0x1b] = 0xe2;
                      puVar36[0x1c] = 200;
                      puVar36[0x1d] = 0xa8;
                      puVar36[0x1e] = '3';
                      puVar36[0x1f] = 0x9c;
                      ppVar20 = local_48->buf;
                      ppVar20->off = ppVar20->off + 0x20;
                      uStack_6e0 = 0x119420;
                      uVar31 = ptls_buffer_reserve(ppVar20,1);
                      if (uVar31 == 0) {
                        ppVar20->base[ppVar20->off] = '\0';
                        ppVar20->off = ppVar20->off + 1;
                        uVar31 = 0;
                      }
                      bVar66 = true;
                      if (uVar31 == 0) {
                        sVar63 = local_48->buf->off;
                        uStack_6e0 = 0x1196ad;
                        uVar33 = ptls_buffer__do_pushv
                                           (local_48->buf,(ch->legacy_session_id).base,
                                            (ch->legacy_session_id).len);
                        uVar31 = 0;
                        if (uVar33 == 0) {
                          local_48->buf->base[sVar63 - 1] =
                               (char)(int)local_48->buf->off - (char)sVar63;
                          bVar68 = true;
                          bVar66 = false;
                        }
                        else {
                          bVar68 = false;
                          uVar31 = uVar33;
                        }
                      }
                      else {
                        bVar68 = false;
                      }
                      if (bVar68) {
                        uVar6 = local_58->cipher_suite->id;
                        ppVar20 = local_48->buf;
                        uStack_6e0 = 0x1198ac;
                        uVar31 = ptls_buffer_reserve(ppVar20,2);
                        if (uVar31 == 0) {
                          *(ushort *)(ppVar20->base + ppVar20->off) = uVar6 << 8 | uVar6 >> 8;
                          ppVar20->off = ppVar20->off + 2;
                          uVar31 = 0;
                        }
                        bVar66 = uVar31 != 0;
                        if (uVar31 == 0) {
                          ppVar20 = local_48->buf;
                          uStack_6e0 = 0x1198f9;
                          uVar31 = ptls_buffer_reserve(ppVar20,1);
                          if (uVar31 == 0) {
                            ppVar20->base[ppVar20->off] = '\0';
                            ppVar20->off = ppVar20->off + 1;
                            uVar31 = 0;
                          }
                          bVar66 = true;
                          if (uVar31 == 0) {
                            ppVar20 = local_48->buf;
                            uStack_6e0 = 0x119938;
                            uVar31 = ptls_buffer_reserve(ppVar20,2);
                            if (uVar31 == 0) {
                              puVar36 = ppVar20->base;
                              sVar63 = ppVar20->off;
                              (puVar36 + sVar63)[0] = '\0';
                              (puVar36 + sVar63)[1] = '\0';
                              ppVar20->off = ppVar20->off + 2;
                              uVar31 = 0;
                            }
                            bVar66 = true;
                            if (uVar31 == 0) {
                              ppVar20 = local_48->buf;
                              local_38 = (ptls_key_schedule_t *)ppVar20->off;
                              uStack_6e0 = 0x119983;
                              uVar31 = ptls_buffer_reserve(ppVar20,2);
                              if (uVar31 == 0) {
                                puVar36 = ppVar20->base;
                                sVar63 = ppVar20->off;
                                (puVar36 + sVar63)[0] = '\0';
                                (puVar36 + sVar63)[1] = '+';
                                ppVar20->off = ppVar20->off + 2;
                                uVar31 = 0;
                              }
                              bVar66 = uVar31 != 0;
                              if (uVar31 == 0) {
                                ppVar20 = local_48->buf;
                                uStack_6e0 = 0x119c83;
                                uVar31 = ptls_buffer_reserve(ppVar20,2);
                                if (uVar31 == 0) {
                                  puVar36 = ppVar20->base;
                                  sVar63 = ppVar20->off;
                                  (puVar36 + sVar63)[0] = '\0';
                                  (puVar36 + sVar63)[1] = '\0';
                                  ppVar20->off = ppVar20->off + 2;
                                  uVar31 = 0;
                                }
                                bVar66 = true;
                                if (uVar31 == 0) {
                                  ppVar20 = local_48->buf;
                                  sVar63 = ppVar20->off;
                                  local_68 = (ptls_key_schedule_t *)
                                             CONCAT62(local_68._2_6_,ch->selected_version);
                                  uStack_6e0 = 0x119cd1;
                                  uVar31 = ptls_buffer_reserve(ppVar20,2);
                                  if (uVar31 == 0) {
                                    *(ushort *)(ppVar20->base + ppVar20->off) =
                                         (ushort)local_68 << 8 | (ushort)local_68 >> 8;
                                    ppVar20->off = ppVar20->off + 2;
                                    uVar31 = 0;
                                  }
                                  bVar66 = uVar31 != 0;
                                  if (uVar31 == 0) {
                                    uVar44 = local_48->buf->off - sVar63;
                                    lVar38 = 8;
                                    do {
                                      local_48->buf->base[sVar63 - 2] =
                                           (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                      lVar38 = lVar38 + -8;
                                      sVar63 = sVar63 + 1;
                                    } while (lVar38 != -8);
                                    bVar66 = false;
                                  }
                                }
                                if (!bVar66) {
                                  local_68 = (ptls_key_schedule_t *)auStack_138;
                                  if (auStack_138 == (undefined1  [8])0x0 ||
                                      local_50 != (ptls_key_schedule_t *)0x0) {
LAB_0011aad6:
                                    bVar66 = false;
                                  }
                                  else {
                                    ppVar20 = local_48->buf;
                                    uStack_6e0 = 0x11aaf2;
                                    uVar31 = ptls_buffer_reserve(ppVar20,2);
                                    if (uVar31 == 0) {
                                      puVar36 = ppVar20->base;
                                      sVar63 = ppVar20->off;
                                      (puVar36 + sVar63)[0] = '\0';
                                      (puVar36 + sVar63)[1] = '3';
                                      ppVar20->off = ppVar20->off + 2;
                                      uVar31 = 0;
                                    }
                                    bVar66 = uVar31 != 0;
                                    if (uVar31 == 0) {
                                      ppVar20 = local_48->buf;
                                      uStack_6e0 = 0x11ac34;
                                      uVar31 = ptls_buffer_reserve(ppVar20,2);
                                      if (uVar31 == 0) {
                                        puVar36 = ppVar20->base;
                                        sVar63 = ppVar20->off;
                                        (puVar36 + sVar63)[0] = '\0';
                                        (puVar36 + sVar63)[1] = '\0';
                                        ppVar20->off = ppVar20->off + 2;
                                        uVar31 = 0;
                                      }
                                      bVar66 = true;
                                      if (uVar31 == 0) {
                                        ppVar20 = local_48->buf;
                                        sVar63 = ppVar20->off;
                                        local_68 = (ptls_key_schedule_t *)
                                                   CONCAT62(local_68._2_6_,
                                                            *(undefined2 *)&local_68->generation);
                                        uStack_6e0 = 0x11b362;
                                        uVar31 = ptls_buffer_reserve(ppVar20,2);
                                        if (uVar31 == 0) {
                                          *(ushort *)(ppVar20->base + ppVar20->off) =
                                               (ushort)local_68 << 8 | (ushort)local_68 >> 8;
                                          ppVar20->off = ppVar20->off + 2;
                                          uVar31 = 0;
                                        }
                                        bVar66 = uVar31 != 0;
                                        if (!bVar66) {
                                          uVar44 = local_48->buf->off - sVar63;
                                          lVar38 = 8;
                                          do {
                                            local_48->buf->base[sVar63 - 2] =
                                                 (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                            lVar38 = lVar38 + -8;
                                            sVar63 = sVar63 + 1;
                                          } while (lVar38 != -8);
                                          goto LAB_0011aad6;
                                        }
                                      }
                                    }
                                  }
                                  if (!bVar66) {
                                    uVar44 = local_48->buf->off - (long)local_38;
                                    lVar38 = 8;
                                    do {
                                      *(uint8_t *)
                                       ((long)local_38->secret + (long)(local_48->buf->base + -0x12)
                                       ) = (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                      lVar38 = lVar38 + -8;
                                      local_38 = (ptls_key_schedule_t *)
                                                 ((long)&local_38->generation + 1);
                                      bVar66 = false;
                                    } while (lVar38 != -8);
                                  }
                                }
                              }
                            }
                            if (!bVar66) {
                              uVar44 = ppVar42->off - (long)local_80;
                              lVar38 = 0x10;
                              do {
                                (ppVar42->base + -3)[(long)local_80] =
                                     (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                lVar38 = lVar38 + -8;
                                local_80 = (ptls_handshake_properties_t *)
                                           ((long)&(local_80->field_0).client.negotiated_protocols.
                                                   list + 1);
                                bVar66 = false;
                              } while (lVar38 != -8);
                            }
                          }
                        }
                      }
                    }
                  }
                }
                if (((!bVar66) && (bVar66 = false, local_88 != (ptls_key_schedule_t *)0x0)) &&
                   (local_88->num_hashes != 0)) {
                  local_80 = (ptls_handshake_properties_t *)
                             ((long)local_40->secret + (long)(ppVar42->base + -0x10));
                  local_40 = (ptls_key_schedule_t *)(ppVar42->off - (long)local_40);
                  pppVar62 = &local_88->hashes[0].ctx;
                  bVar66 = false;
                  sVar63 = 0;
                  do {
                    uStack_6e0 = 0x11ada7;
                    (*(*pppVar62)->update)(*pppVar62,local_80,(size_t)local_40);
                    sVar63 = sVar63 + 1;
                    pppVar62 = pppVar62 + 2;
                  } while (sVar63 != local_88->num_hashes);
                }
              }
              if (!bVar66) {
                uStack_6e0 = 0x11acf0;
                uVar31 = (*local_48->commit_message)(local_48);
                bVar66 = uVar31 != 0;
              }
            }
            else {
              bVar66 = true;
            }
            if (!bVar66) {
              uStack_6e0 = 0x11ad15;
              uVar31 = push_change_cipher_spec(local_58,local_48);
              bVar66 = true;
              if (uVar31 == 0) {
                local_58->state = PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
                uVar31 = 0x202;
                if (((ch->psk).field_0xb4 & 1) != 0) {
                  (local_58->field_18).server.early_data_skipped_bytes = 0;
                }
              }
            }
          }
          else {
            uStack_6e0 = 0x119103;
            uVar31 = (*local_48->begin_message)(local_48);
            if (uVar31 == 0) {
              ppVar42 = local_48->buf;
              uStack_6e0 = 0x119211;
              uVar31 = ptls_buffer_reserve(ppVar42,1);
              if (uVar31 == 0) {
                ppVar42->base[ppVar42->off] = '\x02';
                ppVar42->off = ppVar42->off + 1;
                uVar31 = 0;
              }
              bVar68 = true;
              bVar66 = bVar68;
              if (uVar31 == 0) {
                uStack_6e0 = 0x119247;
                uVar31 = ptls_buffer_reserve(ppVar42,3);
                if (uVar31 == 0) {
                  puVar36 = ppVar42->base;
                  sVar63 = ppVar42->off;
                  puVar36[sVar63 + 2] = '\0';
                  puVar36 = puVar36 + sVar63;
                  puVar36[0] = '\0';
                  puVar36[1] = '\0';
                  ppVar42->off = ppVar42->off + 3;
                  uVar31 = 0;
                }
                if (uVar31 == 0) {
                  local_88 = (ptls_key_schedule_t *)ppVar42->off;
                  ppVar20 = local_48->buf;
                  uStack_6e0 = 0x11928e;
                  uVar31 = ptls_buffer_reserve(ppVar20,2);
                  if (uVar31 == 0) {
                    puVar36 = ppVar20->base;
                    sVar63 = ppVar20->off;
                    (puVar36 + sVar63)[0] = '\x03';
                    (puVar36 + sVar63)[1] = '\x03';
                    ppVar20->off = ppVar20->off + 2;
                    uVar31 = 0;
                  }
                  bVar66 = uVar31 != 0;
                  if (uVar31 == 0) {
                    uStack_6e0 = 0x119490;
                    uVar31 = ptls_buffer_reserve(local_48->buf,0x20);
                    bVar66 = bVar68;
                    if (uVar31 == 0) {
                      puVar36 = local_48->buf->base + local_48->buf->off;
                      puVar36[0] = 0xcf;
                      puVar36[1] = '!';
                      puVar36[2] = 0xad;
                      puVar36[3] = 't';
                      puVar36[4] = 0xe5;
                      puVar36[5] = 0x9a;
                      puVar36[6] = 'a';
                      puVar36[7] = '\x11';
                      puVar36[8] = 0xbe;
                      puVar36[9] = '\x1d';
                      puVar36[10] = 0x8c;
                      puVar36[0xb] = '\x02';
                      puVar36[0xc] = '\x1e';
                      puVar36[0xd] = 'e';
                      puVar36[0xe] = 0xb8;
                      puVar36[0xf] = 0x91;
                      puVar36[0x10] = 0xc2;
                      puVar36[0x11] = 0xa2;
                      puVar36[0x12] = '\x11';
                      puVar36[0x13] = '\x16';
                      puVar36[0x14] = 'z';
                      puVar36[0x15] = 0xbb;
                      puVar36[0x16] = 0x8c;
                      puVar36[0x17] = '^';
                      puVar36[0x18] = '\a';
                      puVar36[0x19] = 0x9e;
                      puVar36[0x1a] = '\t';
                      puVar36[0x1b] = 0xe2;
                      puVar36[0x1c] = 200;
                      puVar36[0x1d] = 0xa8;
                      puVar36[0x1e] = '3';
                      puVar36[0x1f] = 0x9c;
                      ppVar20 = local_48->buf;
                      ppVar20->off = ppVar20->off + 0x20;
                      uStack_6e0 = 0x1194cf;
                      uVar31 = ptls_buffer_reserve(ppVar20,1);
                      if (uVar31 == 0) {
                        ppVar20->base[ppVar20->off] = '\0';
                        ppVar20->off = ppVar20->off + 1;
                        uVar31 = 0;
                      }
                      bVar66 = true;
                      if (uVar31 == 0) {
                        sVar63 = local_48->buf->off;
                        uStack_6e0 = 0x119852;
                        uVar33 = ptls_buffer__do_pushv
                                           (local_48->buf,(ch->legacy_session_id).base,
                                            (ch->legacy_session_id).len);
                        uVar31 = 0;
                        if (uVar33 == 0) {
                          local_48->buf->base[sVar63 - 1] =
                               (char)(int)local_48->buf->off - (char)sVar63;
                          bVar68 = true;
                          bVar66 = false;
                        }
                        else {
                          bVar68 = false;
                          uVar31 = uVar33;
                        }
                      }
                      else {
                        bVar68 = false;
                      }
                      if (bVar68) {
                        uVar6 = local_58->cipher_suite->id;
                        ppVar20 = local_48->buf;
                        uStack_6e0 = 0x119a01;
                        uVar31 = ptls_buffer_reserve(ppVar20,2);
                        if (uVar31 == 0) {
                          *(ushort *)(ppVar20->base + ppVar20->off) = uVar6 << 8 | uVar6 >> 8;
                          ppVar20->off = ppVar20->off + 2;
                          uVar31 = 0;
                        }
                        bVar66 = uVar31 != 0;
                        if (uVar31 == 0) {
                          ppVar20 = local_48->buf;
                          uStack_6e0 = 0x119a4e;
                          uVar31 = ptls_buffer_reserve(ppVar20,1);
                          if (uVar31 == 0) {
                            ppVar20->base[ppVar20->off] = '\0';
                            ppVar20->off = ppVar20->off + 1;
                            uVar31 = 0;
                          }
                          bVar66 = true;
                          if (uVar31 == 0) {
                            ppVar20 = local_48->buf;
                            uStack_6e0 = 0x119a8d;
                            uVar31 = ptls_buffer_reserve(ppVar20,2);
                            if (uVar31 == 0) {
                              puVar36 = ppVar20->base;
                              sVar63 = ppVar20->off;
                              (puVar36 + sVar63)[0] = '\0';
                              (puVar36 + sVar63)[1] = '\0';
                              ppVar20->off = ppVar20->off + 2;
                              uVar31 = 0;
                            }
                            bVar66 = true;
                            if (uVar31 == 0) {
                              ppVar20 = local_48->buf;
                              local_40 = (ptls_key_schedule_t *)ppVar20->off;
                              uStack_6e0 = 0x119ad8;
                              uVar31 = ptls_buffer_reserve(ppVar20,2);
                              if (uVar31 == 0) {
                                puVar36 = ppVar20->base;
                                sVar63 = ppVar20->off;
                                (puVar36 + sVar63)[0] = '\0';
                                (puVar36 + sVar63)[1] = '+';
                                ppVar20->off = ppVar20->off + 2;
                                uVar31 = 0;
                              }
                              bVar66 = uVar31 != 0;
                              if (uVar31 == 0) {
                                ppVar20 = local_48->buf;
                                uStack_6e0 = 0x11a62a;
                                uVar31 = ptls_buffer_reserve(ppVar20,2);
                                if (uVar31 == 0) {
                                  puVar36 = ppVar20->base;
                                  sVar63 = ppVar20->off;
                                  (puVar36 + sVar63)[0] = '\0';
                                  (puVar36 + sVar63)[1] = '\0';
                                  ppVar20->off = ppVar20->off + 2;
                                  uVar31 = 0;
                                }
                                bVar66 = true;
                                if (uVar31 == 0) {
                                  ppVar20 = local_48->buf;
                                  sVar63 = ppVar20->off;
                                  local_38 = (ptls_key_schedule_t *)
                                             CONCAT62(local_38._2_6_,ch->selected_version);
                                  uStack_6e0 = 0x11a678;
                                  uVar31 = ptls_buffer_reserve(ppVar20,2);
                                  if (uVar31 == 0) {
                                    *(ushort *)(ppVar20->base + ppVar20->off) =
                                         (ushort)local_38 << 8 | (ushort)local_38 >> 8;
                                    ppVar20->off = ppVar20->off + 2;
                                    uVar31 = 0;
                                  }
                                  bVar66 = uVar31 != 0;
                                  if (uVar31 == 0) {
                                    uVar44 = local_48->buf->off - sVar63;
                                    lVar38 = 8;
                                    do {
                                      local_48->buf->base[sVar63 - 2] =
                                           (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                      lVar38 = lVar38 + -8;
                                      sVar63 = sVar63 + 1;
                                    } while (lVar38 != -8);
                                    bVar66 = false;
                                  }
                                }
                                if (!bVar66) {
                                  local_68 = (ptls_key_schedule_t *)auStack_138;
                                  if (auStack_138 == (undefined1  [8])0x0 ||
                                      local_50 != (ptls_key_schedule_t *)0x0) {
LAB_0011ae1f:
                                    local_38 = (ptls_key_schedule_t *)local_48->buf;
                                    uStack_6e0 = 0x11ae34;
                                    uVar31 = ptls_buffer_reserve((ptls_buffer_t *)local_38,2);
                                    if (uVar31 == 0) {
                                      *(undefined2 *)(*(long *)local_38 + *(long *)local_38->secret)
                                           = 0x2c00;
                                      *(long *)local_38->secret = *(long *)local_38->secret + 2;
                                      uVar31 = 0;
                                    }
                                    bVar66 = uVar31 != 0;
                                    if (!bVar66) {
                                      uStack_6e0 = 0x11ae6e;
                                      uVar31 = ptls_buffer_reserve((ptls_buffer_t *)local_38,2);
                                      if (uVar31 == 0) {
                                        *(undefined2 *)
                                         (*(long *)local_38 + *(long *)local_38->secret) = 0;
                                        *(long *)local_38->secret = *(long *)local_38->secret + 2;
                                        uVar31 = 0;
                                      }
                                      bVar66 = true;
                                      if (uVar31 == 0) {
                                        lVar38 = *(long *)local_38->secret;
                                        uStack_6e0 = 0x11aeaf;
                                        uVar31 = ptls_buffer_reserve((ptls_buffer_t *)local_38,2);
                                        if (uVar31 == 0) {
                                          *(undefined2 *)
                                           (*(long *)local_38 + *(long *)local_38->secret) = 0;
                                          *(long *)local_38->secret = *(long *)local_38->secret + 2;
                                          uVar31 = 0;
                                        }
                                        bVar66 = true;
                                        if (uVar31 == 0) {
                                          local_60 = *(ptls_buffer_t **)local_38->secret;
                                          uStack_6e0 = 0x11aef4;
                                          uVar31 = ptls_buffer_reserve((ptls_buffer_t *)local_38,2);
                                          if (uVar31 == 0) {
                                            *(undefined2 *)
                                             (*(long *)local_38 + *(long *)local_38->secret) = 0;
                                            *(long *)local_38->secret =
                                                 *(long *)local_38->secret + 2;
                                            uVar31 = 0;
                                          }
                                          bVar66 = true;
                                          if (uVar31 == 0) {
                                            local_50 = *(ptls_key_schedule_t **)local_38->secret;
                                            uStack_6e0 = 0x11af39;
                                            uVar31 = ptls_buffer_reserve((ptls_buffer_t *)local_38,1
                                                                        );
                                            if (uVar31 == 0) {
                                              *(undefined1 *)
                                               (*(long *)local_38 + *(long *)local_38->secret) = 0;
                                              *(long *)local_38->secret =
                                                   *(long *)local_38->secret + 1;
                                              uVar31 = 0;
                                            }
                                            bVar66 = true;
                                            if (uVar31 == 0) {
                                              local_70 = *(ptls_key_schedule_t **)local_38->secret;
                                              local_78 = local_58->cipher_suite->hash->digest_size;
                                              uStack_6e0 = 0x11af89;
                                              uVar31 = ptls_buffer_reserve((ptls_buffer_t *)local_38
                                                                           ,local_78);
                                              ppVar35 = local_38;
                                              bVar66 = true;
                                              if (uVar31 == 0) {
                                                psVar12 = local_58->key_schedule->hashes[0].ctx;
                                                uStack_6e0 = 0x11afb5;
                                                (*psVar12->final)(psVar12,(void *)(*(long *)local_38
                                                                                  + *(long *)
                                                  local_38->secret),PTLS_HASH_FINAL_MODE_RESET);
                                                *(size_t *)ppVar35->secret =
                                                     *(long *)ppVar35->secret + local_78;
                                                *(char *)((long)local_70->secret +
                                                         *(long *)local_38 + -0x11) =
                                                     (char)*(undefined4 *)local_38->secret -
                                                     (char)local_70;
                                                bVar66 = false;
                                              }
                                            }
                                            sVar63 = ecdh_secret.len;
                                            if (!bVar66) {
                                              uStack_6e0 = 0x11aff6;
                                              uVar31 = ptls_buffer_reserve((ptls_buffer_t *)local_38
                                                                           ,1);
                                              if (uVar31 == 0) {
                                                *(bool *)(*(long *)local_38 +
                                                         *(long *)local_38->secret) = sVar63 == 0;
                                                *(long *)local_38->secret =
                                                     *(long *)local_38->secret + 1;
                                                uVar31 = 0;
                                              }
                                              bVar66 = true;
                                              if (uVar31 == 0) {
                                                uVar44 = *(long *)local_38->secret - (long)local_50;
                                                lVar41 = 8;
                                                do {
                                                  *(char *)((long)local_50->secret +
                                                           *(long *)local_38 + -0x12) =
                                                       (char)(uVar44 >> ((byte)lVar41 & 0x3f));
                                                  lVar41 = lVar41 + -8;
                                                  local_50 = (ptls_key_schedule_t *)
                                                             ((long)&local_50->generation + 1);
                                                } while (lVar41 != -8);
                                                bVar66 = false;
                                                uVar31 = 0;
                                              }
                                            }
                                          }
                                          if (!bVar66) {
                                            local_50 = *(ptls_key_schedule_t **)local_38->secret;
                                            uStack_6e0 = 0x11b07d;
                                            uVar31 = ptls_buffer_reserve((ptls_buffer_t *)local_38,1
                                                                        );
                                            if (uVar31 == 0) {
                                              *(undefined1 *)
                                               (*(long *)local_38 + *(long *)local_38->secret) = 0;
                                              *(long *)local_38->secret =
                                                   *(long *)local_38->secret + 1;
                                              uVar31 = 0;
                                            }
                                            bVar66 = true;
                                            if (uVar31 == 0) {
                                              local_70 = *(ptls_key_schedule_t **)local_38->secret;
                                              local_78 = (*local_58->ctx->cipher_suites)->hash->
                                                         digest_size;
                                              uStack_6e0 = 0x11b0d4;
                                              uVar31 = ptls_buffer_reserve((ptls_buffer_t *)local_38
                                                                           ,local_78);
                                              bVar66 = true;
                                              if (uVar31 == 0) {
                                                tbs.len = (long)local_50 - (long)local_60;
                                                tbs.base = (uint8_t *)
                                                           ((long)&local_60->base +
                                                           *(long *)local_38);
                                                uStack_6e0 = 0x11bd26;
                                                uVar33 = calc_cookie_signature
                                                                   (local_58,local_80,
                                                                    (ptls_key_exchange_algorithm_t *
                                                                    )local_68,tbs,
                                                                    (uint8_t *)
                                                                    (*(long *)local_38 +
                                                                    *(size_t *)local_38->secret));
                                                uVar31 = 0;
                                                if (uVar33 == 0) {
                                                  *(size_t *)local_38->secret =
                                                       *(size_t *)local_38->secret + local_78;
                                                  bVar68 = true;
                                                  bVar66 = false;
                                                }
                                                else {
                                                  bVar68 = false;
                                                  uVar31 = uVar33;
                                                }
                                              }
                                              else {
                                                bVar68 = false;
                                              }
                                              if (bVar68) {
                                                *(char *)((long)local_70->secret +
                                                         *(long *)local_38 + -0x11) =
                                                     (char)(int)*(size_t *)local_38->secret -
                                                     (char)local_70;
                                                bVar66 = false;
                                              }
                                            }
                                          }
                                          if (!bVar66) {
                                            uVar44 = *(size_t *)local_38->secret - (long)local_60;
                                            lVar41 = 8;
                                            do {
                                              *(char *)(*(long *)local_38 + -2 + (long)local_60) =
                                                   (char)(uVar44 >> ((byte)lVar41 & 0x3f));
                                              lVar41 = lVar41 + -8;
                                              local_60 = (ptls_buffer_t *)
                                                         ((long)&local_60->base + 1);
                                            } while (lVar41 != -8);
                                            bVar66 = false;
                                          }
                                        }
                                        if (!bVar66) {
                                          uVar44 = *(size_t *)local_38->secret - lVar38;
                                          lVar41 = 8;
                                          do {
                                            *(char *)(*(long *)local_38 + -2 + lVar38) =
                                                 (char)(uVar44 >> ((byte)lVar41 & 0x3f));
                                            lVar41 = lVar41 + -8;
                                            lVar38 = lVar38 + 1;
                                            bVar66 = false;
                                          } while (lVar41 != -8);
                                        }
                                      }
                                    }
                                  }
                                  else {
                                    ppVar20 = local_48->buf;
                                    uStack_6e0 = 0x11b100;
                                    uVar31 = ptls_buffer_reserve(ppVar20,2);
                                    if (uVar31 == 0) {
                                      puVar36 = ppVar20->base;
                                      sVar63 = ppVar20->off;
                                      (puVar36 + sVar63)[0] = '\0';
                                      (puVar36 + sVar63)[1] = '3';
                                      ppVar20->off = ppVar20->off + 2;
                                      uVar31 = 0;
                                    }
                                    bVar66 = uVar31 != 0;
                                    if (!bVar66) {
                                      ppVar20 = local_48->buf;
                                      uStack_6e0 = 0x11b2b2;
                                      uVar31 = ptls_buffer_reserve(ppVar20,2);
                                      if (uVar31 == 0) {
                                        puVar36 = ppVar20->base;
                                        sVar63 = ppVar20->off;
                                        (puVar36 + sVar63)[0] = '\0';
                                        (puVar36 + sVar63)[1] = '\0';
                                        ppVar20->off = ppVar20->off + 2;
                                        uVar31 = 0;
                                      }
                                      bVar66 = true;
                                      if (uVar31 == 0) {
                                        ppVar20 = local_48->buf;
                                        sVar63 = ppVar20->off;
                                        local_38 = (ptls_key_schedule_t *)
                                                   CONCAT62(local_38._2_6_,
                                                            *(undefined2 *)&local_68->generation);
                                        uStack_6e0 = 0x11b303;
                                        uVar31 = ptls_buffer_reserve(ppVar20,2);
                                        if (uVar31 == 0) {
                                          *(ushort *)(ppVar20->base + ppVar20->off) =
                                               (ushort)local_38 << 8 | (ushort)local_38 >> 8;
                                          ppVar20->off = ppVar20->off + 2;
                                          uVar31 = 0;
                                        }
                                        bVar66 = uVar31 != 0;
                                        if (uVar31 == 0) {
                                          uVar44 = local_48->buf->off - sVar63;
                                          lVar38 = 8;
                                          do {
                                            local_48->buf->base[sVar63 - 2] =
                                                 (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                            lVar38 = lVar38 + -8;
                                            sVar63 = sVar63 + 1;
                                          } while (lVar38 != -8);
                                          bVar66 = false;
                                        }
                                      }
                                      if (!bVar66) goto LAB_0011ae1f;
                                    }
                                  }
                                  if (!bVar66) {
                                    uVar44 = local_48->buf->off - (long)local_40;
                                    lVar38 = 8;
                                    do {
                                      *(uint8_t *)
                                       ((long)local_40->secret + (long)(local_48->buf->base + -0x12)
                                       ) = (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                      lVar38 = lVar38 + -8;
                                      local_40 = (ptls_key_schedule_t *)
                                                 ((long)&local_40->generation + 1);
                                      bVar66 = false;
                                    } while (lVar38 != -8);
                                  }
                                }
                              }
                            }
                            if (!bVar66) {
                              uVar44 = ppVar42->off - (long)local_88;
                              lVar38 = 0x10;
                              do {
                                local_88->secret[(long)(ppVar42->base + -0x13)] =
                                     (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                lVar38 = lVar38 + -8;
                                local_88 = (ptls_key_schedule_t *)((long)&local_88->generation + 1);
                                bVar66 = false;
                              } while (lVar38 != -8);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              if (!bVar66) {
                uStack_6e0 = 0x11b1bd;
                uVar31 = (*local_48->commit_message)(local_48);
                bVar66 = uVar31 != 0;
              }
            }
            else {
              bVar66 = true;
            }
            if (!bVar66) {
              uStack_6e0 = 0x11b1e2;
              uVar33 = push_change_cipher_spec(local_58,local_48);
              uVar31 = 0x206;
              if (uVar33 != 0) {
                uVar31 = uVar33;
              }
              goto LAB_00118bb2;
            }
          }
        }
        else {
LAB_00118bb2:
          bVar66 = true;
        }
        ppVar35 = local_6d8;
        if (!bVar66) {
          return uVar31;
        }
        goto LAB_00117197;
      }
    }
    else {
      local_38 = (ptls_key_schedule_t *)(*local_58->ctx->cipher_suites)->hash->digest_size;
      lVar38 = -((ulong)((long)&local_38->hkdf_label_prefix + 7) & 0xfffffffffffffff0);
      sig = (ptls_key_schedule_t *)((long)local_6d8 + lVar38);
      pVar69 = (ch->cookie).tbs;
      local_50 = (ptls_key_schedule_t *)ecdh_secret.len;
      local_68 = sig;
      *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x118a28;
      uVar31 = calc_cookie_signature
                         (ppVar28,ppVar61,(ptls_key_exchange_algorithm_t *)sVar65,pVar69,
                          (uint8_t *)sig);
      ppVar49 = local_38;
      ppVar35 = local_68;
      iVar30 = 2;
      if (uVar31 == 0) {
        uVar31 = 0x28;
        if ((ptls_key_schedule_t *)(ch->cookie).signature.len == local_38) {
          puVar51 = (ch->cookie).signature.base;
          *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x118a68;
          iVar30 = (*ptls_mem_equal)(puVar51,ppVar35,(size_t)ppVar49);
          ppVar28 = local_58;
          if (iVar30 != 0) {
            ppVar35 = local_58->key_schedule;
            *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x118a7d;
            key_schedule_update_ch1hash_prefix(ppVar35);
            local_38 = ppVar28->key_schedule;
            if (local_38->num_hashes != 0) {
              local_68 = (ptls_key_schedule_t *)(ch->cookie).ch1_hash.base;
              local_60 = (ptls_buffer_t *)(ch->cookie).ch1_hash.len;
              pppVar62 = &local_38->hashes[0].ctx;
              sVar65 = 0;
              do {
                ppVar42 = local_60;
                ppVar35 = local_68;
                psVar12 = *pppVar62;
                p_Var13 = psVar12->update;
                *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x118abb;
                (*p_Var13)(psVar12,ppVar35,(size_t)ppVar42);
                sVar65 = sVar65 + 1;
                pppVar62 = pppVar62 + 2;
              } while (sVar65 != local_38->num_hashes);
            }
            ppVar35 = local_58->key_schedule;
            *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x118add;
            key_schedule_extract(ppVar35,(ptls_iovec_t)ZEXT816(0));
            ppVar29 = local_48;
            local_68 = (ptls_key_schedule_t *)local_48->buf->off;
            p_Var14 = local_48->begin_message;
            *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x118aef;
            uVar31 = (*p_Var14)(ppVar29);
            if (uVar31 == 0) {
              ppVar42 = local_48->buf;
              local_70 = local_58->key_schedule;
              local_78 = ppVar42->off;
              local_60 = ppVar42;
              *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x11902b;
              uVar31 = ptls_buffer_reserve(ppVar42,1);
              ppVar42 = local_60;
              if (uVar31 == 0) {
                local_60->base[local_60->off] = '\x02';
                local_60->off = local_60->off + 1;
                uVar31 = 0;
              }
              local_38 = (ptls_key_schedule_t *)0x2;
              if (uVar31 == 0) {
                *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x119068;
                uVar31 = ptls_buffer_reserve(ppVar42,3);
                if (uVar31 == 0) {
                  ppVar16 = (ptls_hash_context_t *)local_60->base;
                  sVar65 = local_60->off;
                  *(undefined1 *)((long)&ppVar16->update + sVar65 + 2) = 0;
                  *(undefined2 *)((long)&ppVar16->update + sVar65) = 0;
                  local_60->off = local_60->off + 3;
                  uVar31 = 0;
                }
                local_38 = (ptls_key_schedule_t *)0x2;
                if (uVar31 == 0) {
                  local_b0 = (st_ptls_signature_algorithms_t *)local_60->off;
                  ppVar42 = local_48->buf;
                  *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x1190c2;
                  uVar31 = ptls_buffer_reserve(ppVar42,2);
                  if (uVar31 == 0) {
                    puVar51 = ppVar42->base;
                    sVar65 = ppVar42->off;
                    (puVar51 + sVar65)[0] = '\x03';
                    (puVar51 + sVar65)[1] = '\x03';
                    ppVar42->off = ppVar42->off + 2;
                    uVar31 = 0;
                  }
                  if (uVar31 == 0) {
                    ppVar42 = local_48->buf;
                    *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x11935b;
                    uVar31 = ptls_buffer_reserve(ppVar42,0x20);
                    if (uVar31 == 0) {
                      puVar51 = local_48->buf->base + local_48->buf->off;
                      puVar51[0] = 0xcf;
                      puVar51[1] = '!';
                      puVar51[2] = 0xad;
                      puVar51[3] = 't';
                      puVar51[4] = 0xe5;
                      puVar51[5] = 0x9a;
                      puVar51[6] = 'a';
                      puVar51[7] = '\x11';
                      puVar51[8] = 0xbe;
                      puVar51[9] = '\x1d';
                      puVar51[10] = 0x8c;
                      puVar51[0xb] = '\x02';
                      puVar51[0xc] = '\x1e';
                      puVar51[0xd] = 'e';
                      puVar51[0xe] = 0xb8;
                      puVar51[0xf] = 0x91;
                      puVar51[0x10] = 0xc2;
                      puVar51[0x11] = 0xa2;
                      puVar51[0x12] = '\x11';
                      puVar51[0x13] = '\x16';
                      puVar51[0x14] = 'z';
                      puVar51[0x15] = 0xbb;
                      puVar51[0x16] = 0x8c;
                      puVar51[0x17] = '^';
                      puVar51[0x18] = '\a';
                      puVar51[0x19] = 0x9e;
                      puVar51[0x1a] = '\t';
                      puVar51[0x1b] = 0xe2;
                      puVar51[0x1c] = 200;
                      puVar51[0x1d] = 0xa8;
                      puVar51[0x1e] = '3';
                      puVar51[0x1f] = 0x9c;
                      ppVar42 = local_48->buf;
                      ppVar42->off = ppVar42->off + 0x20;
                      local_38 = (ptls_key_schedule_t *)ppVar42;
                      *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x11939a;
                      uVar31 = ptls_buffer_reserve(ppVar42,1);
                      if (uVar31 == 0) {
                        (*(uint8_t **)&local_38->generation)[*(size_t *)local_38->secret] = '\0';
                        *(size_t *)local_38->secret = *(size_t *)local_38->secret + 1;
                        uVar31 = 0;
                      }
                      local_38 = (ptls_key_schedule_t *)0x2;
                      if (uVar31 == 0) {
                        ppVar42 = local_48->buf;
                        local_a0 = (ptls_iovec_t *)ppVar42->off;
                        puVar51 = (ch->legacy_session_id).base;
                        sVar65 = (ch->legacy_session_id).len;
                        *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x119687;
                        uVar33 = ptls_buffer__do_pushv(ppVar42,puVar51,sVar65);
                        uVar31 = 0;
                        if (uVar33 == 0) {
                          (local_48->buf->base + -1)[(long)local_a0] =
                               (char)(int)local_48->buf->off - (char)local_a0;
                          bVar66 = true;
                          local_38 = (ptls_key_schedule_t *)0x0;
                        }
                        else {
                          bVar66 = false;
                          uVar31 = uVar33;
                        }
                      }
                      else {
                        bVar66 = false;
                      }
                      if (bVar66) {
                        local_a0 = (ptls_iovec_t *)
                                   CONCAT62(local_a0._2_6_,local_58->cipher_suite->id);
                        ppVar42 = local_48->buf;
                        local_38 = (ptls_key_schedule_t *)ppVar42;
                        *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x119718;
                        uVar31 = ptls_buffer_reserve(ppVar42,2);
                        if (uVar31 == 0) {
                          *(ushort *)
                           (*(uint8_t **)&local_38->generation + *(size_t *)local_38->secret) =
                               (ushort)local_a0 << 8 | (ushort)local_a0 >> 8;
                          *(size_t *)local_38->secret = *(size_t *)local_38->secret + 2;
                          uVar31 = 0;
                        }
                        if (uVar31 == 0) {
                          ppVar42 = local_48->buf;
                          *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x11976c;
                          uVar31 = ptls_buffer_reserve(ppVar42,1);
                          if (uVar31 == 0) {
                            ppVar42->base[ppVar42->off] = '\0';
                            ppVar42->off = ppVar42->off + 1;
                            uVar31 = 0;
                          }
                          local_38 = (ptls_key_schedule_t *)0x2;
                          if (uVar31 == 0) {
                            ppVar42 = local_48->buf;
                            *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x1197ae;
                            uVar31 = ptls_buffer_reserve(ppVar42,2);
                            if (uVar31 == 0) {
                              puVar51 = ppVar42->base;
                              sVar65 = ppVar42->off;
                              (puVar51 + sVar65)[0] = '\0';
                              (puVar51 + sVar65)[1] = '\0';
                              ppVar42->off = ppVar42->off + 2;
                              uVar31 = 0;
                            }
                            local_38 = (ptls_key_schedule_t *)0x2;
                            if (uVar31 == 0) {
                              ppVar42 = local_48->buf;
                              local_a0 = (ptls_iovec_t *)ppVar42->off;
                              local_38 = (ptls_key_schedule_t *)ppVar42;
                              *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x1197ff;
                              uVar31 = ptls_buffer_reserve(ppVar42,2);
                              if (uVar31 == 0) {
                                puVar51 = *(uint8_t **)&local_38->generation;
                                sVar65 = *(size_t *)local_38->secret;
                                (puVar51 + sVar65)[0] = '\0';
                                (puVar51 + sVar65)[1] = '+';
                                *(size_t *)local_38->secret = *(size_t *)local_38->secret + 2;
                                uVar31 = 0;
                              }
                              if (uVar31 == 0) {
                                ppVar42 = local_48->buf;
                                *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x119bcc;
                                uVar31 = ptls_buffer_reserve(ppVar42,2);
                                if (uVar31 == 0) {
                                  puVar51 = ppVar42->base;
                                  sVar65 = ppVar42->off;
                                  (puVar51 + sVar65)[0] = '\0';
                                  (puVar51 + sVar65)[1] = '\0';
                                  ppVar42->off = ppVar42->off + 2;
                                  uVar31 = 0;
                                }
                                local_38 = (ptls_key_schedule_t *)0x2;
                                if (uVar31 == 0) {
                                  ppVar42 = local_48->buf;
                                  local_38 = (ptls_key_schedule_t *)ppVar42->off;
                                  psk_index = CONCAT62(psk_index._2_6_,ch->selected_version);
                                  _uStack_148 = ppVar42;
                                  *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x119c28;
                                  uVar31 = ptls_buffer_reserve(ppVar42,2);
                                  if (uVar31 == 0) {
                                    *(ushort *)(_uStack_148->base + _uStack_148->off) =
                                         (ushort)psk_index << 8 | (ushort)psk_index >> 8;
                                    _uStack_148->off = _uStack_148->off + 2;
                                    uVar31 = 0;
                                  }
                                  if (uVar31 == 0) {
                                    uVar44 = local_48->buf->off - (long)local_38;
                                    lVar41 = 8;
                                    do {
                                      local_48->buf->base[(long)local_38 - 2] =
                                           (uint8_t)(uVar44 >> ((byte)lVar41 & 0x3f));
                                      lVar41 = lVar41 + -8;
                                      local_38 = (ptls_key_schedule_t *)((long)local_38 + 1);
                                    } while (lVar41 != -8);
                                    local_38 = (ptls_key_schedule_t *)0x0;
                                  }
                                  else {
                                    local_38 = (ptls_key_schedule_t *)
                                               (ulong)((uint)(uVar31 != 0) * 2);
                                  }
                                }
                                if ((int)local_38 == 0) {
                                  if (((ch->cookie).field_0x40 & 1) == 0) {
LAB_0011a7b1:
                                    ppVar42 = local_48->buf;
                                    *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x11a7c5;
                                    uVar31 = ptls_buffer_reserve(ppVar42,2);
                                    if (uVar31 == 0) {
                                      puVar51 = ppVar42->base;
                                      sVar65 = ppVar42->off;
                                      (puVar51 + sVar65)[0] = '\0';
                                      (puVar51 + sVar65)[1] = ',';
                                      ppVar42->off = ppVar42->off + 2;
                                      uVar31 = 0;
                                    }
                                    bVar66 = uVar31 != 0;
                                    if (bVar66) {
LAB_0011a8ee:
                                      local_38 = (ptls_key_schedule_t *)(ulong)((uint)bVar66 * 2);
                                    }
                                    else {
                                      ppVar42 = local_48->buf;
                                      *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x11a804;
                                      uVar31 = ptls_buffer_reserve(ppVar42,2);
                                      if (uVar31 == 0) {
                                        puVar51 = ppVar42->base;
                                        sVar65 = ppVar42->off;
                                        (puVar51 + sVar65)[0] = '\0';
                                        (puVar51 + sVar65)[1] = '\0';
                                        ppVar42->off = ppVar42->off + 2;
                                        uVar31 = 0;
                                      }
                                      local_38 = (ptls_key_schedule_t *)0x2;
                                      if (uVar31 == 0) {
                                        ppVar42 = local_48->buf;
                                        local_50 = (ptls_key_schedule_t *)ppVar42->off;
                                        puVar51 = (ch->cookie).all.base;
                                        sVar65 = (ch->cookie).all.len;
                                        *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x11a857;
                                        uVar31 = ptls_buffer__do_pushv(ppVar42,puVar51,sVar65);
                                        if (uVar31 == 0) {
                                          uVar44 = local_48->buf->off - (long)local_50;
                                          lVar41 = 8;
                                          uVar31 = 0;
                                          do {
                                            *(uint8_t *)
                                             ((long)local_50->secret +
                                             (long)(local_48->buf->base + -0x12)) =
                                                 (uint8_t)(uVar44 >> ((byte)lVar41 & 0x3f));
                                            lVar41 = lVar41 + -8;
                                            local_50 = (ptls_key_schedule_t *)
                                                       ((long)&local_50->generation + 1);
                                            local_38 = (ptls_key_schedule_t *)0x0;
                                          } while (lVar41 != -8);
                                        }
                                      }
                                    }
                                  }
                                  else {
                                    ppVar42 = local_48->buf;
                                    *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x11a8c3;
                                    uVar31 = ptls_buffer_reserve(ppVar42,2);
                                    if (uVar31 == 0) {
                                      puVar51 = ppVar42->base;
                                      sVar65 = ppVar42->off;
                                      (puVar51 + sVar65)[0] = '\0';
                                      (puVar51 + sVar65)[1] = '3';
                                      ppVar42->off = ppVar42->off + 2;
                                      uVar31 = 0;
                                    }
                                    bVar66 = uVar31 != 0;
                                    if (bVar66) goto LAB_0011a8ee;
                                    ppVar42 = local_48->buf;
                                    *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x11ab80;
                                    uVar31 = ptls_buffer_reserve(ppVar42,2);
                                    if (uVar31 == 0) {
                                      puVar51 = ppVar42->base;
                                      sVar65 = ppVar42->off;
                                      (puVar51 + sVar65)[0] = '\0';
                                      (puVar51 + sVar65)[1] = '\0';
                                      ppVar42->off = ppVar42->off + 2;
                                      uVar31 = 0;
                                    }
                                    local_38 = (ptls_key_schedule_t *)0x2;
                                    if (uVar31 == 0) {
                                      ppVar35 = (ptls_key_schedule_t *)local_48->buf;
                                      local_38 = *(ptls_key_schedule_t **)ppVar35->secret;
                                      _uStack_148 = (ptls_buffer_t *)
                                                    CONCAT62(uStack_146,
                                                             *(undefined2 *)&local_50->generation);
                                      local_50 = ppVar35;
                                      *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x11abdc;
                                      uVar31 = ptls_buffer_reserve((ptls_buffer_t *)ppVar35,2);
                                      if (uVar31 == 0) {
                                        *(ushort *)(*(long *)local_50 + *(size_t *)local_50->secret)
                                             = uStack_148 << 8 | uStack_148 >> 8;
                                        *(size_t *)local_50->secret =
                                             *(size_t *)local_50->secret + 2;
                                        uVar31 = 0;
                                      }
                                      if (uVar31 == 0) {
                                        uVar44 = local_48->buf->off - (long)local_38;
                                        lVar41 = 8;
                                        do {
                                          local_48->buf->base[(long)local_38 - 2] =
                                               (uint8_t)(uVar44 >> ((byte)lVar41 & 0x3f));
                                          lVar41 = lVar41 + -8;
                                          local_38 = (ptls_key_schedule_t *)((long)local_38 + 1);
                                        } while (lVar41 != -8);
                                        local_38 = (ptls_key_schedule_t *)0x0;
                                      }
                                      else {
                                        local_38 = (ptls_key_schedule_t *)
                                                   (ulong)((uint)(uVar31 != 0) * 2);
                                      }
                                    }
                                    if ((int)local_38 == 0) goto LAB_0011a7b1;
                                  }
                                  if ((int)local_38 == 0) {
                                    uVar44 = local_48->buf->off - (long)local_a0;
                                    lVar41 = 8;
                                    do {
                                      (local_48->buf->base + -2)[(long)local_a0] =
                                           (uint8_t)(uVar44 >> ((byte)lVar41 & 0x3f));
                                      lVar41 = lVar41 + -8;
                                      local_a0 = (ptls_iovec_t *)((long)&local_a0->base + 1);
                                      local_38 = (ptls_key_schedule_t *)0x0;
                                    } while (lVar41 != -8);
                                  }
                                }
                              }
                              else {
                                local_38 = (ptls_key_schedule_t *)(ulong)((uint)(uVar31 != 0) * 2);
                              }
                            }
                            if ((int)local_38 == 0) {
                              uVar44 = local_60->off - (long)local_b0;
                              lVar41 = 0x10;
                              do {
                                *(char *)((long)local_b0->list +
                                         (long)((long)&((ptls_hash_context_t *)local_60->base)[-1].
                                                       clone_ + 5)) =
                                     (char)(uVar44 >> ((byte)lVar41 & 0x3f));
                                lVar41 = lVar41 + -8;
                                local_b0 = (st_ptls_signature_algorithms_t *)
                                           ((long)local_b0->list + 1);
                                local_38 = (ptls_key_schedule_t *)0x0;
                              } while (lVar41 != -8);
                            }
                          }
                        }
                        else {
                          local_38 = (ptls_key_schedule_t *)(ulong)((uint)(uVar31 != 0) * 2);
                        }
                      }
                    }
                  }
                  else {
                    local_38 = (ptls_key_schedule_t *)(ulong)((uint)(uVar31 != 0) * 2);
                  }
                }
                if ((((int)local_38 == 0) &&
                    (local_38 = (ptls_key_schedule_t *)0x0, local_70 != (ptls_key_schedule_t *)0x0))
                   && (local_70->num_hashes != 0)) {
                  local_50 = (ptls_key_schedule_t *)
                             ((long)&((ptls_hash_context_t *)local_60->base)->update + local_78);
                  local_78 = local_60->off - local_78;
                  ppVar42 = (ptls_buffer_t *)&local_70->hashes[0].ctx;
                  local_38 = (ptls_key_schedule_t *)0x0;
                  sVar65 = 0;
                  do {
                    ppVar35 = local_50;
                    sVar60 = local_78;
                    psVar12 = (st_ptls_hash_context_t *)ppVar42->base;
                    p_Var13 = psVar12->update;
                    local_60 = ppVar42;
                    *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x11aa5e;
                    (*p_Var13)(psVar12,ppVar35,sVar60);
                    sVar65 = sVar65 + 1;
                    ppVar42 = (ptls_buffer_t *)&local_60->off;
                  } while (sVar65 != local_70->num_hashes);
                }
              }
              ppVar29 = local_48;
              if ((int)local_38 == 0) {
                p_Var14 = local_48->commit_message;
                *(undefined8 *)((long)local_6d8 + lVar38 + -8) = 0x11a9ef;
                uVar31 = (*p_Var14)(ppVar29);
                local_38 = (ptls_key_schedule_t *)(ulong)((uint)(uVar31 != 0) * 2);
              }
            }
            else {
              local_38 = (ptls_key_schedule_t *)0x2;
            }
            ppVar61 = local_80;
            iVar30 = (int)local_38;
            if ((int)local_38 == 0) {
              local_48->buf->off = (size_t)local_68;
              local_88 = (ptls_key_schedule_t *)CONCAT44(local_88._4_4_,1);
              iVar30 = 0;
            }
            goto LAB_0011a9d2;
          }
        }
        ppVar61 = local_80;
        iVar30 = 2;
      }
LAB_0011a9d2:
      if (iVar30 != 0) {
        ppVar35 = sig;
        if (iVar30 != 2) {
          return uVar31;
        }
        goto LAB_00117197;
      }
    }
  }
  ppVar28 = local_58;
  sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x1188d5;
  uVar31 = report_unknown_extensions(ppVar28,ppVar61,ch->unknown_extensions);
  ppVar28 = local_58;
  ppVar35 = sig;
  if (uVar31 != 0) goto LAB_00117197;
  if ((((int)local_88 == 0) && (puVar51 = (ch->psk).hash_end, puVar51 != (uint8_t *)0x0)) &&
     ((((ch->psk).ke_modes & 3) != 0 &&
      ((local_58->ctx->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0 &&
       ((local_58->ctx->field_0x70 & 8) == 0)))))) {
    ch_trunc.len = (long)puVar51 - (long)puVar36;
    sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x118dff;
    ch_trunc.base = puVar36;
    uVar31 = try_psk_handshake(ppVar28,(size_t *)&local_178,&local_14c,ch,ch_trunc);
    if (uVar31 != 0) goto LAB_00117197;
  }
  local_38 = local_178;
  if ((local_178 == (ptls_key_schedule_t *)0xffffffffffffffff) ||
     ((local_58->ctx->field_0x70 & 8) != 0)) {
    local_40 = local_58->key_schedule;
    if (local_40->num_hashes != 0) {
      pppVar62 = &local_40->hashes[0].ctx;
      sVar65 = 0;
      do {
        psVar12 = *pppVar62;
        p_Var13 = psVar12->update;
        sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x118bf4;
        (*p_Var13)(psVar12,puVar36,sVar63);
        sVar65 = sVar65 + 1;
        pppVar62 = pppVar62 + 2;
      } while (sVar65 != local_40->num_hashes);
    }
    if ((int)local_88 == 0) {
      ppVar49 = local_58->key_schedule;
      if (ppVar49->generation != 0) {
        sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b259;
        __assert_fail("tls->key_schedule->generation == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                      ,0xf83,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x118c25;
      key_schedule_extract(ppVar49,(ptls_iovec_t)ZEXT816(0));
    }
    local_88 = (ptls_key_schedule_t *)0x0;
    if (local_80 != (ptls_handshake_properties_t *)0x0) {
      sVar34 = 0;
      ppVar61 = local_80;
      goto LAB_00118c39;
    }
  }
  else {
    local_88 = local_58->key_schedule;
    if (local_88->num_hashes != 0) {
      puVar36 = (ch->psk).hash_end;
      sVar65 = (long)local_40 - (long)puVar36;
      pppVar62 = &local_88->hashes[0].ctx;
      sVar63 = 0;
      do {
        psVar12 = *pppVar62;
        p_Var13 = psVar12->update;
        sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x118941;
        (*p_Var13)(psVar12,puVar36,sVar65);
        sVar63 = sVar63 + 1;
        pppVar62 = pppVar62 + 2;
      } while (sVar63 != local_88->num_hashes);
    }
    ppVar61 = local_80;
    uVar31 = (ch->psk).ke_modes;
    local_88 = (ptls_key_schedule_t *)0x1;
    if (((uVar31 & 1) == 0) && (local_88 = (ptls_key_schedule_t *)0x2, (uVar31 & 2) == 0)) {
      sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b3e9;
      __assert_fail("(ch->psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0xf8e,
                    "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                   );
    }
    local_58->field_0x160 = local_58->field_0x160 | 2;
    if (local_80 != (ptls_handshake_properties_t *)0x0) {
      puVar36 = (ch->psk).identities.list[(long)local_38].binder.base;
      sVar34 = (ch->psk).identities.list[(long)local_38].binder.len;
      sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x1189b3;
      memcpy(ppVar61,puVar36,sVar34);
LAB_00118c39:
      *(size_t *)((long)&ppVar61->field_0 + 0x40) = sVar34;
    }
  }
  if (((local_14c != 0) && (local_38 == (ptls_key_schedule_t *)0x0)) &&
     (local_58->ctx->max_early_data_size != 0)) {
    sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x118c64;
    puVar36 = (uint8_t *)malloc(0x40);
    ppVar28 = local_58;
    local_58->pending_handshake_secret = puVar36;
    uVar31 = 0x201;
    if (puVar36 == (uint8_t *)0x0) goto LAB_00117197;
    sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x118c8c;
    uVar31 = derive_exporter_secret(ppVar28,1);
    ppVar28 = local_58;
    if (uVar31 != 0) goto LAB_00117197;
    sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x118cae;
    uVar31 = setup_traffic_protection(ppVar28,0,"c e traffic",1,0);
    if (uVar31 != 0) goto LAB_00117197;
  }
  ppVar27 = key_share.algorithm;
  sVar63 = ecdh_secret.len;
  if ((int)local_88 != 1) {
    if (ecdh_secret.len == 0) {
      uVar31 = 0x28;
      if ((ch->key_shares).base == (uint8_t *)0x0) {
        uVar31 = 0x6d;
      }
      goto LAB_00117197;
    }
    pcVar15 = *(code **)(ecdh_secret.len + 0x10);
    sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x118e3f;
    uVar31 = (*pcVar15)(sVar63,&pvStack_1b8,&pubkey.len,ppVar27);
    if (uVar31 != 0) goto LAB_00117197;
    local_58->key_share = (ptls_key_exchange_algorithm_t *)sVar63;
  }
  ppVar29 = local_48;
  p_Var14 = local_48->begin_message;
  sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x118cc7;
  uVar31 = (*p_Var14)(ppVar29);
  if (uVar31 == 0) {
    ppVar42 = local_48->buf;
    local_38 = local_58->key_schedule;
    sVar63 = ppVar42->off;
    sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x118e94;
    uVar31 = ptls_buffer_reserve(ppVar42,1);
    if (uVar31 == 0) {
      ppVar42->base[ppVar42->off] = '\x02';
      ppVar42->off = ppVar42->off + 1;
      uVar31 = 0;
    }
    local_40 = (ptls_key_schedule_t *)0x2;
    if (uVar31 == 0) {
      sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x118ecc;
      uVar31 = ptls_buffer_reserve(ppVar42,3);
      if (uVar31 == 0) {
        puVar36 = ppVar42->base;
        sVar65 = ppVar42->off;
        puVar36[sVar65 + 2] = '\0';
        puVar36 = puVar36 + sVar65;
        puVar36[0] = '\0';
        puVar36[1] = '\0';
        ppVar42->off = ppVar42->off + 3;
        uVar31 = 0;
      }
      local_40 = (ptls_key_schedule_t *)0x2;
      if (uVar31 == 0) {
        local_68 = (ptls_key_schedule_t *)ppVar42->off;
        ppVar20 = local_48->buf;
        sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x118f1b;
        uVar31 = ptls_buffer_reserve(ppVar20,2);
        if (uVar31 == 0) {
          puVar36 = ppVar20->base;
          sVar65 = ppVar20->off;
          (puVar36 + sVar65)[0] = '\x03';
          (puVar36 + sVar65)[1] = '\x03';
          ppVar20->off = ppVar20->off + 2;
          uVar31 = 0;
        }
        if (uVar31 == 0) {
          ppVar20 = local_48->buf;
          sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x1192d8;
          uVar31 = ptls_buffer_reserve(ppVar20,0x20);
          ppVar29 = local_48;
          if (uVar31 == 0) {
            puVar36 = local_48->buf->base;
            sVar65 = local_48->buf->off;
            p_Var17 = local_58->ctx->random_bytes;
            sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x1192ff;
            (*p_Var17)(puVar36 + sVar65,0x20);
            ppVar20 = ppVar29->buf;
            ppVar20->off = ppVar20->off + 0x20;
            sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x119315;
            uVar31 = ptls_buffer_reserve(ppVar20,1);
            if (uVar31 == 0) {
              ppVar20->base[ppVar20->off] = '\0';
              ppVar20->off = ppVar20->off + 1;
              uVar31 = 0;
            }
            local_40 = (ptls_key_schedule_t *)0x2;
            if (uVar31 == 0) {
              ppVar20 = local_48->buf;
              sVar65 = ppVar20->off;
              puVar36 = (ch->legacy_session_id).base;
              sVar60 = (ch->legacy_session_id).len;
              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11946a;
              uVar33 = ptls_buffer__do_pushv(ppVar20,puVar36,sVar60);
              uVar31 = 0;
              if (uVar33 == 0) {
                local_48->buf->base[sVar65 - 1] = (char)(int)local_48->buf->off - (char)sVar65;
                bVar66 = true;
                local_40 = (ptls_key_schedule_t *)0x0;
              }
              else {
                bVar66 = false;
                uVar31 = uVar33;
              }
            }
            else {
              bVar66 = false;
            }
            if (bVar66) {
              local_40 = (ptls_key_schedule_t *)CONCAT62(local_40._2_6_,local_58->cipher_suite->id);
              ppVar20 = local_48->buf;
              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11954e;
              uVar31 = ptls_buffer_reserve(ppVar20,2);
              if (uVar31 == 0) {
                *(ushort *)(ppVar20->base + ppVar20->off) =
                     (ushort)local_40 << 8 | (ushort)local_40 >> 8;
                ppVar20->off = ppVar20->off + 2;
                uVar31 = 0;
              }
              if (uVar31 == 0) {
                ppVar20 = local_48->buf;
                sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11959e;
                uVar31 = ptls_buffer_reserve(ppVar20,1);
                if (uVar31 == 0) {
                  ppVar20->base[ppVar20->off] = '\0';
                  ppVar20->off = ppVar20->off + 1;
                  uVar31 = 0;
                }
                local_40 = (ptls_key_schedule_t *)0x2;
                if (uVar31 == 0) {
                  ppVar20 = local_48->buf;
                  sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x1195e0;
                  uVar31 = ptls_buffer_reserve(ppVar20,2);
                  if (uVar31 == 0) {
                    puVar36 = ppVar20->base;
                    sVar65 = ppVar20->off;
                    (puVar36 + sVar65)[0] = '\0';
                    (puVar36 + sVar65)[1] = '\0';
                    ppVar20->off = ppVar20->off + 2;
                    uVar31 = 0;
                  }
                  local_40 = (ptls_key_schedule_t *)0x2;
                  if (uVar31 == 0) {
                    ppVar20 = local_48->buf;
                    local_60 = (ptls_buffer_t *)ppVar20->off;
                    sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11962e;
                    uVar31 = ptls_buffer_reserve(ppVar20,2);
                    if (uVar31 == 0) {
                      puVar36 = ppVar20->base;
                      sVar65 = ppVar20->off;
                      (puVar36 + sVar65)[0] = '\0';
                      (puVar36 + sVar65)[1] = '+';
                      ppVar20->off = ppVar20->off + 2;
                      uVar31 = 0;
                    }
                    if (uVar31 == 0) {
                      ppVar20 = local_48->buf;
                      sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x119b25;
                      uVar31 = ptls_buffer_reserve(ppVar20,2);
                      if (uVar31 == 0) {
                        puVar36 = ppVar20->base;
                        sVar65 = ppVar20->off;
                        (puVar36 + sVar65)[0] = '\0';
                        (puVar36 + sVar65)[1] = '\0';
                        ppVar20->off = ppVar20->off + 2;
                        uVar31 = 0;
                      }
                      local_40 = (ptls_key_schedule_t *)0x2;
                      if (uVar31 == 0) {
                        ppVar20 = local_48->buf;
                        sVar65 = ppVar20->off;
                        local_50 = (ptls_key_schedule_t *)
                                   CONCAT62(local_50._2_6_,ch->selected_version);
                        local_40 = (ptls_key_schedule_t *)ppVar20;
                        sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x119b77;
                        uVar31 = ptls_buffer_reserve(ppVar20,2);
                        if (uVar31 == 0) {
                          *(ushort *)
                           (*(uint8_t **)&local_40->generation + *(size_t *)local_40->secret) =
                               (ushort)local_50 << 8 | (ushort)local_50 >> 8;
                          *(size_t *)local_40->secret = *(size_t *)local_40->secret + 2;
                          uVar31 = 0;
                        }
                        if (uVar31 == 0) {
                          uVar44 = local_48->buf->off - sVar65;
                          lVar38 = 8;
                          do {
                            local_48->buf->base[sVar65 - 2] =
                                 (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                            lVar38 = lVar38 + -8;
                            sVar65 = sVar65 + 1;
                          } while (lVar38 != -8);
                          local_40 = (ptls_key_schedule_t *)0x0;
                        }
                        else {
                          local_40 = (ptls_key_schedule_t *)(ulong)((uint)(uVar31 != 0) * 2);
                        }
                      }
                      if ((int)local_40 == 0) {
                        ppVar49 = (ptls_key_schedule_t *)local_48->buf;
                        local_50 = ppVar49;
                        if ((int)local_88 == 1) {
LAB_00119d69:
                          ppVar49 = local_50;
                          if ((int)local_88 == 0) {
LAB_00119e67:
                            local_40 = (ptls_key_schedule_t *)0x0;
                          }
                          else {
                            sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x119d81;
                            uVar31 = ptls_buffer_reserve((ptls_buffer_t *)ppVar49,2);
                            ppVar49 = local_50;
                            if (uVar31 == 0) {
                              *(undefined2 *)(*(long *)local_50 + *(long *)local_50->secret) =
                                   0x2900;
                              *(long *)local_50->secret = *(long *)local_50->secret + 2;
                              uVar31 = 0;
                            }
                            bVar66 = uVar31 != 0;
                            if (!bVar66) {
                              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x119dbb;
                              uVar31 = ptls_buffer_reserve((ptls_buffer_t *)ppVar49,2);
                              ppVar49 = local_50;
                              if (uVar31 == 0) {
                                *(undefined2 *)(*(long *)local_50 + *(long *)local_50->secret) = 0;
                                *(long *)local_50->secret = *(long *)local_50->secret + 2;
                                uVar31 = 0;
                              }
                              local_40 = (ptls_key_schedule_t *)0x2;
                              if (uVar31 != 0) goto LAB_00119eb5;
                              lVar38 = *(long *)local_50->secret;
                              local_40 = local_178;
                              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x119e0a;
                              uVar31 = ptls_buffer_reserve((ptls_buffer_t *)ppVar49,2);
                              if (uVar31 == 0) {
                                *(ushort *)(*(long *)local_50 + *(size_t *)local_50->secret) =
                                     (ushort)local_40 << 8 | (ushort)local_40 >> 8;
                                *(size_t *)local_50->secret = *(size_t *)local_50->secret + 2;
                                uVar31 = 0;
                              }
                              bVar66 = uVar31 != 0;
                              if (!bVar66) {
                                uVar44 = *(size_t *)local_50->secret - lVar38;
                                lVar41 = 8;
                                do {
                                  *(char *)(*(long *)local_50 + -2 + lVar38) =
                                       (char)(uVar44 >> ((byte)lVar41 & 0x3f));
                                  lVar41 = lVar41 + -8;
                                  lVar38 = lVar38 + 1;
                                } while (lVar41 != -8);
                                goto LAB_00119e67;
                              }
                            }
LAB_00119eab:
                            local_40 = (ptls_key_schedule_t *)(ulong)((uint)bVar66 * 2);
                          }
                        }
                        else {
                          sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x119e7f;
                          uVar31 = ptls_buffer_reserve((ptls_buffer_t *)ppVar49,2);
                          ppVar49 = local_50;
                          if (uVar31 == 0) {
                            *(undefined2 *)(*(long *)local_50 + *(long *)local_50->secret) = 0x3300;
                            *(long *)local_50->secret = *(long *)local_50->secret + 2;
                            uVar31 = 0;
                          }
                          bVar66 = uVar31 != 0;
                          if (bVar66) goto LAB_00119eab;
                          sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a6c2;
                          uVar31 = ptls_buffer_reserve((ptls_buffer_t *)ppVar49,2);
                          ppVar49 = local_50;
                          if (uVar31 == 0) {
                            *(undefined2 *)(*(long *)local_50 + *(long *)local_50->secret) = 0;
                            *(long *)local_50->secret = *(long *)local_50->secret + 2;
                            uVar31 = 0;
                          }
                          local_40 = (ptls_key_schedule_t *)0x2;
                          if (uVar31 == 0) {
                            lVar38 = *(long *)local_50->secret;
                            local_40 = (ptls_key_schedule_t *)(ulong)*(ushort *)ecdh_secret.len;
                            sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a714;
                            uVar31 = ptls_buffer_reserve((ptls_buffer_t *)ppVar49,2);
                            ppVar49 = local_50;
                            if (uVar31 == 0) {
                              *(ushort *)(*(long *)local_50 + *(long *)local_50->secret) =
                                   (ushort)local_40 << 8 | (ushort)local_40 >> 8;
                              *(long *)local_50->secret = *(long *)local_50->secret + 2;
                              uVar31 = 0;
                            }
                            if (uVar31 == 0) {
                              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b201;
                              uVar31 = ptls_buffer_reserve((ptls_buffer_t *)ppVar49,2);
                              ppVar49 = local_50;
                              puVar36 = pubkey.base;
                              pvVar26 = pvStack_1b8;
                              if (uVar31 == 0) {
                                *(undefined2 *)(*(long *)local_50 + *(long *)local_50->secret) = 0;
                                *(long *)local_50->secret = *(long *)local_50->secret + 2;
                                uVar31 = 0;
                              }
                              local_40 = (ptls_key_schedule_t *)0x2;
                              if (uVar31 == 0) {
                                lVar41 = *(long *)local_50->secret;
                                sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b423;
                                uVar31 = ptls_buffer__do_pushv
                                                   ((ptls_buffer_t *)ppVar49,pvVar26,(size_t)puVar36
                                                   );
                                if (uVar31 == 0) {
                                  uVar44 = *(size_t *)local_50->secret - lVar41;
                                  lVar43 = 8;
                                  do {
                                    *(char *)(*(long *)local_50 + -2 + lVar41) =
                                         (char)(uVar44 >> ((byte)lVar43 & 0x3f));
                                    lVar43 = lVar43 + -8;
                                    lVar41 = lVar41 + 1;
                                  } while (lVar43 != -8);
                                  local_40 = (ptls_key_schedule_t *)0x0;
                                  bVar66 = true;
                                  uVar31 = 0;
                                }
                                else {
                                  bVar66 = false;
                                }
                              }
                              else {
                                bVar66 = false;
                              }
                              if (bVar66) {
                                uVar44 = *(size_t *)local_50->secret - lVar38;
                                lVar41 = 8;
                                do {
                                  *(char *)(*(long *)local_50 + -2 + lVar38) =
                                       (char)(uVar44 >> ((byte)lVar41 & 0x3f));
                                  lVar41 = lVar41 + -8;
                                  lVar38 = lVar38 + 1;
                                } while (lVar41 != -8);
                                local_40 = (ptls_key_schedule_t *)0x0;
                              }
                            }
                            else {
                              local_40 = (ptls_key_schedule_t *)(ulong)((uint)(uVar31 != 0) * 2);
                            }
                          }
                          if ((int)local_40 == 0) goto LAB_00119d69;
                        }
LAB_00119eb5:
                        if ((int)local_40 == 0) {
                          uVar44 = local_48->buf->off - (long)local_60;
                          lVar38 = 8;
                          do {
                            (local_48->buf->base + -2)[(long)local_60] =
                                 (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                            lVar38 = lVar38 + -8;
                            local_60 = (ptls_buffer_t *)((long)&local_60->base + 1);
                            local_40 = (ptls_key_schedule_t *)0x0;
                          } while (lVar38 != -8);
                        }
                      }
                    }
                    else {
                      local_40 = (ptls_key_schedule_t *)(ulong)((uint)(uVar31 != 0) * 2);
                    }
                  }
                  if ((int)local_40 == 0) {
                    uVar44 = ppVar42->off - (long)local_68;
                    lVar38 = 0x10;
                    do {
                      *(uint8_t *)((long)local_68->secret + (long)(ppVar42->base + -0x13)) =
                           (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                      lVar38 = lVar38 + -8;
                      local_68 = (ptls_key_schedule_t *)((long)&local_68->generation + 1);
                      local_40 = (ptls_key_schedule_t *)0x0;
                    } while (lVar38 != -8);
                  }
                }
              }
              else {
                local_40 = (ptls_key_schedule_t *)(ulong)((uint)(uVar31 != 0) * 2);
              }
            }
          }
        }
        else {
          local_40 = (ptls_key_schedule_t *)(ulong)((uint)(uVar31 != 0) * 2);
        }
      }
      if ((((int)local_40 == 0) &&
          (local_40 = (ptls_key_schedule_t *)0x0, local_38 != (ptls_key_schedule_t *)0x0)) &&
         (local_38->num_hashes != 0)) {
        local_68 = (ptls_key_schedule_t *)(ppVar42->base + sVar63);
        sVar65 = ppVar42->off;
        pppVar62 = &local_38->hashes[0].ctx;
        local_40 = (ptls_key_schedule_t *)0x0;
        sVar60 = 0;
        do {
          ppVar49 = local_68;
          psVar12 = *pppVar62;
          p_Var13 = psVar12->update;
          sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a08c;
          (*p_Var13)(psVar12,ppVar49,sVar65 - sVar63);
          sVar60 = sVar60 + 1;
          pppVar62 = pppVar62 + 2;
        } while (sVar60 != local_38->num_hashes);
      }
    }
    ppVar29 = local_48;
    iVar30 = (int)local_40;
    if (iVar30 == 0) {
      p_Var14 = local_48->commit_message;
      sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x119f56;
      uVar31 = (*p_Var14)(ppVar29);
      iVar30 = (uint)(uVar31 != 0) * 2;
    }
  }
  else {
    iVar30 = 2;
  }
  ppVar29 = local_48;
  ppVar28 = local_58;
  if (iVar30 == 2) goto LAB_00117197;
  if (iVar30 != 0) {
    return uVar31;
  }
  sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x119f80;
  uVar31 = push_change_cipher_spec(ppVar28,ppVar29);
  if (uVar31 != 0) goto LAB_00117197;
  ppVar49 = local_58->key_schedule;
  if (ppVar49->generation != 1) {
    sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11bc11;
    __assert_fail("tls->key_schedule->generation == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0xfc3,
                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                 );
  }
  ikm.len = (size_t)ecdh_secret.base;
  ikm.base = (uint8_t *)pubkey.len;
  sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x119fac;
  key_schedule_extract(ppVar49,ikm);
  ppVar28 = local_58;
  sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x119fc9;
  uVar31 = setup_traffic_protection(ppVar28,1,"s hs traffic",2,0);
  ppVar28 = local_58;
  if (uVar31 != 0) goto LAB_00117197;
  puVar36 = local_58->pending_handshake_secret;
  if (puVar36 == (uint8_t *)0x0) {
    sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a0bc;
    uVar31 = setup_traffic_protection(ppVar28,0,"c hs traffic",2,0);
    if (uVar31 != 0) goto LAB_00117197;
    if (((ch->psk).field_0xb4 & 1) != 0) {
      (local_58->field_18).server.early_data_skipped_bytes = 0;
    }
  }
  else {
    ppVar49 = local_58->key_schedule;
    sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x119ff9;
    uVar31 = derive_secret(ppVar49,puVar36,"c hs traffic");
    ppVar28 = local_58;
    if (uVar31 != 0) goto LAB_00117197;
    psVar18 = local_58->ctx->update_traffic_key;
    if (psVar18 != (st_ptls_update_traffic_key_t *)0x0) {
      puVar36 = local_58->pending_handshake_secret;
      p_Var19 = psVar18->cb;
      sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a02c;
      uVar31 = (*p_Var19)(psVar18,ppVar28,0,2,puVar36);
      if (uVar31 != 0) goto LAB_00117197;
    }
  }
  ppVar29 = local_48;
  p_Var14 = local_48->begin_message;
  sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a0e2;
  uVar31 = (*p_Var14)(ppVar29);
  if (uVar31 == 0) {
    ppVar42 = local_48->buf;
    local_38 = local_58->key_schedule;
    local_68 = (ptls_key_schedule_t *)ppVar42->off;
    sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a11f;
    uVar31 = ptls_buffer_reserve(ppVar42,1);
    if (uVar31 == 0) {
      ppVar42->base[ppVar42->off] = '\b';
      ppVar42->off = ppVar42->off + 1;
      uVar31 = 0;
    }
    local_40 = (ptls_key_schedule_t *)0x2;
    if (uVar31 == 0) {
      sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a157;
      uVar31 = ptls_buffer_reserve(ppVar42,3);
      if (uVar31 == 0) {
        puVar36 = ppVar42->base;
        sVar63 = ppVar42->off;
        puVar36[sVar63 + 2] = '\0';
        puVar36 = puVar36 + sVar63;
        puVar36[0] = '\0';
        puVar36[1] = '\0';
        ppVar42->off = ppVar42->off + 3;
        uVar31 = 0;
      }
      local_40 = (ptls_key_schedule_t *)0x2;
      if (uVar31 == 0) {
        sVar63 = ppVar42->off;
        ppVar20 = local_48->buf;
        local_60 = ppVar20;
        sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a1a3;
        uVar31 = ptls_buffer_reserve(ppVar20,2);
        ppVar20 = local_60;
        if (uVar31 == 0) {
          puVar36 = local_60->base;
          sVar65 = local_60->off;
          (puVar36 + sVar65)[0] = '\0';
          (puVar36 + sVar65)[1] = '\0';
          local_60->off = local_60->off + 2;
          uVar31 = 0;
        }
        local_40 = (ptls_key_schedule_t *)0x2;
        if (uVar31 == 0) {
          local_50 = (ptls_key_schedule_t *)local_60->off;
          if (local_58->esni == (ptls_esni_secret_t *)0x0) {
            if (local_58->server_name != (char *)0x0) {
              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a2e3;
              uVar31 = ptls_buffer_reserve(ppVar20,2);
              ppVar20 = local_60;
              if (uVar31 == 0) {
                puVar36 = local_60->base;
                sVar65 = local_60->off;
                (puVar36 + sVar65)[0] = '\0';
                (puVar36 + sVar65)[1] = '\0';
                local_60->off = local_60->off + 2;
                uVar31 = 0;
              }
              bVar66 = uVar31 != 0;
              if (bVar66) goto LAB_0011b584;
              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a31d;
              uVar33 = ptls_buffer_reserve(ppVar20,2);
              if (uVar33 == 0) {
                *(undefined2 *)
                 ((long)&((ptls_hash_context_t *)local_60->base)->update + local_60->off) = 0;
                local_60->off = local_60->off + 2;
                uVar33 = 0;
              }
              local_40 = (ptls_key_schedule_t *)0x2;
              uVar31 = uVar33;
              if (uVar33 == 0) {
                sVar65 = local_60->off;
                lVar38 = -2;
                do {
                  *(undefined1 *)
                   ((long)&((ptls_hash_context_t *)local_60->base)->update + lVar38 + sVar65) = 0;
                  lVar38 = lVar38 + 1;
                } while (lVar38 != 0);
                local_40 = (ptls_key_schedule_t *)0x0;
                uVar31 = 0;
              }
              if (uVar33 != 0) goto LAB_0011b58e;
            }
LAB_0011a428:
            ppVar20 = local_60;
            if ((local_58->ctx->field_0x70 & 0x20) != 0) {
              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a567;
              uVar31 = ptls_buffer_reserve(ppVar20,2);
              ppVar20 = local_60;
              if (uVar31 == 0) {
                puVar36 = local_60->base;
                sVar65 = local_60->off;
                (puVar36 + sVar65)[0] = '\0';
                (puVar36 + sVar65)[1] = '\x14';
                local_60->off = local_60->off + 2;
                uVar31 = 0;
              }
              bVar66 = uVar31 != 0;
              if (bVar66) goto LAB_0011b584;
              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a5a1;
              uVar31 = ptls_buffer_reserve(ppVar20,2);
              ppVar20 = local_60;
              if (uVar31 == 0) {
                puVar36 = local_60->base;
                sVar65 = local_60->off;
                (puVar36 + sVar65)[0] = '\0';
                (puVar36 + sVar65)[1] = '\0';
                local_60->off = local_60->off + 2;
                uVar31 = 0;
              }
              local_40 = (ptls_key_schedule_t *)0x2;
              if (uVar31 == 0) {
                sVar65 = local_60->off;
                sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a5e1;
                uVar31 = ptls_buffer_reserve(ppVar20,1);
                if (uVar31 == 0) {
                  *(undefined1 *)
                   ((long)&((ptls_hash_context_t *)local_60->base)->update + local_60->off) = 2;
                  local_60->off = local_60->off + 1;
                  uVar31 = 0;
                }
                if (uVar31 != 0) goto LAB_0011a607;
                uVar44 = local_60->off - sVar65;
                lVar38 = 8;
                do {
                  *(char *)((long)local_60->base + (sVar65 - 2)) =
                       (char)(uVar44 >> ((byte)lVar38 & 0x3f));
                  lVar38 = lVar38 + -8;
                  sVar65 = sVar65 + 1;
                } while (lVar38 != -8);
                local_40 = (ptls_key_schedule_t *)0x0;
                bVar66 = true;
                uVar31 = 0;
              }
              else {
LAB_0011a607:
                bVar66 = false;
              }
              if (!bVar66) goto LAB_0011b58e;
            }
            ppVar20 = local_60;
            if (local_58->negotiated_protocol != (char *)0x0) {
              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a459;
              uVar31 = ptls_buffer_reserve(ppVar20,2);
              ppVar20 = local_60;
              if (uVar31 == 0) {
                puVar36 = local_60->base;
                sVar65 = local_60->off;
                (puVar36 + sVar65)[0] = '\0';
                (puVar36 + sVar65)[1] = '\x10';
                local_60->off = local_60->off + 2;
                uVar31 = 0;
              }
              bVar66 = uVar31 != 0;
              if (bVar66) goto LAB_0011b584;
              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a493;
              uVar31 = ptls_buffer_reserve(ppVar20,2);
              ppVar20 = local_60;
              if (uVar31 == 0) {
                puVar36 = local_60->base;
                sVar65 = local_60->off;
                (puVar36 + sVar65)[0] = '\0';
                (puVar36 + sVar65)[1] = '\0';
                local_60->off = local_60->off + 2;
                uVar31 = 0;
              }
              local_40 = (ptls_key_schedule_t *)0x2;
              if (uVar31 == 0) {
                local_70 = (ptls_key_schedule_t *)local_60->off;
                sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a4db;
                uVar31 = ptls_buffer_reserve(ppVar20,2);
                ppVar20 = local_60;
                if (uVar31 == 0) {
                  puVar36 = local_60->base;
                  sVar65 = local_60->off;
                  (puVar36 + sVar65)[0] = '\0';
                  (puVar36 + sVar65)[1] = '\0';
                  local_60->off = local_60->off + 2;
                  uVar31 = 0;
                }
                local_40 = (ptls_key_schedule_t *)0x2;
                if (uVar31 == 0) {
                  local_78 = local_60->off;
                  sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a523;
                  uVar31 = ptls_buffer_reserve(ppVar20,1);
                  ppVar20 = local_60;
                  if (uVar31 == 0) {
                    local_60->base[local_60->off] = '\0';
                    local_60->off = local_60->off + 1;
                    uVar31 = 0;
                  }
                  local_40 = (ptls_key_schedule_t *)0x2;
                  if (uVar31 == 0) {
                    local_b0 = (st_ptls_signature_algorithms_t *)local_60->off;
                    pcVar8 = local_58->negotiated_protocol;
                    sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b27b;
                    sVar34 = strlen(pcVar8);
                    sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b289;
                    uVar33 = ptls_buffer__do_pushv(ppVar20,pcVar8,sVar34);
                    uVar31 = 0;
                    if (uVar33 == 0) {
                      *(char *)((long)local_b0->list +
                               (long)((long)&((ptls_hash_context_t *)local_60->base)[-1].clone_ + 7)
                               ) = (char)(int)local_60->off - (char)local_b0;
                      bVar66 = true;
                      local_40 = (ptls_key_schedule_t *)0x0;
                    }
                    else {
                      bVar66 = false;
                      uVar31 = uVar33;
                    }
                  }
                  else {
                    bVar66 = false;
                  }
                  if (bVar66) {
                    uVar44 = local_60->off - local_78;
                    lVar38 = 8;
                    do {
                      *(char *)((long)local_60->base + (local_78 - 2)) =
                           (char)(uVar44 >> ((byte)lVar38 & 0x3f));
                      lVar38 = lVar38 + -8;
                      local_78 = local_78 + 1;
                    } while (lVar38 != -8);
                    local_40 = (ptls_key_schedule_t *)0x0;
                  }
                }
                if ((int)local_40 == 0) {
                  uVar44 = local_60->off - (long)local_70;
                  lVar38 = 8;
                  do {
                    *(char *)((long)local_70->secret +
                             (long)((long)&((ptls_hash_context_t *)local_60->base)[-1].update + 6))
                         = (char)(uVar44 >> ((byte)lVar38 & 0x3f));
                    lVar38 = lVar38 + -8;
                    local_70 = (ptls_key_schedule_t *)((long)&local_70->generation + 1);
                  } while (lVar38 != -8);
                  local_40 = (ptls_key_schedule_t *)0x0;
                }
              }
              if ((int)local_40 != 0) goto LAB_0011b58e;
            }
            ppVar20 = local_60;
            if (local_58->pending_handshake_secret != (uint8_t *)0x0) {
              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b558;
              uVar31 = ptls_buffer_reserve(ppVar20,2);
              ppVar20 = local_60;
              if (uVar31 == 0) {
                puVar36 = local_60->base;
                sVar65 = local_60->off;
                (puVar36 + sVar65)[0] = '\0';
                (puVar36 + sVar65)[1] = '*';
                local_60->off = local_60->off + 2;
                uVar31 = 0;
              }
              bVar66 = uVar31 != 0;
              if (bVar66) goto LAB_0011b584;
              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b980;
              uVar33 = ptls_buffer_reserve(ppVar20,2);
              if (uVar33 == 0) {
                *(undefined2 *)
                 ((long)&((ptls_hash_context_t *)local_60->base)->update + local_60->off) = 0;
                local_60->off = local_60->off + 2;
                uVar33 = 0;
              }
              local_40 = (ptls_key_schedule_t *)0x2;
              uVar31 = uVar33;
              if (uVar33 == 0) {
                sVar65 = local_60->off;
                lVar38 = -2;
                do {
                  *(undefined1 *)
                   ((long)&((ptls_hash_context_t *)local_60->base)->update + lVar38 + sVar65) = 0;
                  lVar38 = lVar38 + 1;
                } while (lVar38 != 0);
                local_40 = (ptls_key_schedule_t *)0x0;
                uVar31 = 0;
              }
              if (uVar33 != 0) goto LAB_0011b58e;
            }
            ppVar20 = local_60;
            ppVar61 = local_80;
            sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b9ee;
            uVar31 = push_additional_extensions(ppVar61,ppVar20);
            local_40 = (ptls_key_schedule_t *)0x2;
            if (uVar31 == 0) {
              uVar44 = local_60->off - (long)local_50;
              lVar38 = 8;
              uVar31 = 0;
              do {
                *(char *)((long)local_50->secret +
                         (long)((long)&((ptls_hash_context_t *)local_60->base)[-1].update + 6)) =
                     (char)(uVar44 >> ((byte)lVar38 & 0x3f));
                lVar38 = lVar38 + -8;
                local_50 = (ptls_key_schedule_t *)((long)&local_50->generation + 1);
                local_40 = (ptls_key_schedule_t *)0x0;
              } while (lVar38 != -8);
            }
          }
          else {
            sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a201;
            uVar31 = ptls_buffer_reserve(ppVar20,2);
            ppVar20 = local_60;
            if (uVar31 == 0) {
              puVar36 = local_60->base;
              sVar65 = local_60->off;
              (puVar36 + sVar65)[0] = 0xff;
              (puVar36 + sVar65)[1] = 0xce;
              local_60->off = local_60->off + 2;
              uVar31 = 0;
            }
            bVar66 = uVar31 != 0;
            if (!bVar66) {
              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a23b;
              uVar31 = ptls_buffer_reserve(ppVar20,2);
              ppVar20 = local_60;
              if (uVar31 == 0) {
                puVar36 = local_60->base;
                sVar65 = local_60->off;
                (puVar36 + sVar65)[0] = '\0';
                (puVar36 + sVar65)[1] = '\0';
                local_60->off = local_60->off + 2;
                uVar31 = 0;
              }
              local_70 = (ptls_key_schedule_t *)&local_58->esni;
              local_40 = (ptls_key_schedule_t *)0x2;
              if (uVar31 == 0) {
                sVar65 = local_60->off;
                sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a28d;
                uVar31 = ptls_buffer_reserve(ppVar20,1);
                ppVar20 = local_60;
                if (uVar31 == 0) {
                  local_60->base[local_60->off] = '\0';
                  local_60->off = local_60->off + 1;
                  uVar31 = 0;
                }
                if (uVar31 == 0) {
                  local_40 = *(ptls_key_schedule_t **)local_70;
                  sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a39c;
                  uVar31 = ptls_buffer_reserve(ppVar20,0x10);
                  if (uVar31 == 0) {
                    uVar21 = *(undefined8 *)((long)local_40 + 0x18);
                    puVar4 = (undefined8 *)
                             ((long)&((ptls_hash_context_t *)local_60->base)->update + local_60->off
                             );
                    *puVar4 = *(undefined8 *)((long)local_40 + 0x10);
                    puVar4[1] = uVar21;
                    local_60->off = local_60->off + 0x10;
                    uVar31 = 0;
                  }
                  bVar66 = uVar31 == 0;
                  local_40 = (ptls_key_schedule_t *)(ulong)((uint)!bVar66 * 2);
                }
                else {
                  local_40 = (ptls_key_schedule_t *)0x2;
                  bVar66 = false;
                }
                if (bVar66) {
                  uVar44 = local_60->off - sVar65;
                  lVar38 = 8;
                  do {
                    *(char *)((long)local_60->base + (sVar65 - 2)) =
                         (char)(uVar44 >> ((byte)lVar38 & 0x3f));
                    lVar38 = lVar38 + -8;
                    sVar65 = sVar65 + 1;
                  } while (lVar38 != -8);
                  local_40 = (ptls_key_schedule_t *)0x0;
                }
              }
              ppVar49 = local_70;
              if ((int)local_40 == 0) {
                sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11a428;
                free_esni_secret((ptls_esni_secret_t **)ppVar49,1);
                goto LAB_0011a428;
              }
              goto LAB_0011b58e;
            }
LAB_0011b584:
            local_40 = (ptls_key_schedule_t *)(ulong)((uint)bVar66 * 2);
          }
        }
LAB_0011b58e:
        if ((int)local_40 == 0) {
          uVar44 = ppVar42->off - sVar63;
          lVar38 = 0x10;
          do {
            ppVar42->base[sVar63 - 3] = (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
            lVar38 = lVar38 + -8;
            sVar63 = sVar63 + 1;
          } while (lVar38 != -8);
          local_40 = (ptls_key_schedule_t *)0x0;
        }
      }
      if ((((int)local_40 == 0) &&
          (local_40 = (ptls_key_schedule_t *)0x0, local_38 != (ptls_key_schedule_t *)0x0)) &&
         (local_38->num_hashes != 0)) {
        local_80 = (ptls_handshake_properties_t *)
                   ((long)local_68->secret + (long)(ppVar42->base + -0x10));
        sVar65 = ppVar42->off - (long)local_68;
        pppVar62 = &local_38->hashes[0].ctx;
        local_40 = (ptls_key_schedule_t *)0x0;
        sVar63 = 0;
        do {
          ppVar61 = local_80;
          psVar12 = *pppVar62;
          p_Var13 = psVar12->update;
          sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b7a7;
          (*p_Var13)(psVar12,ppVar61,sVar65);
          sVar63 = sVar63 + 1;
          pppVar62 = pppVar62 + 2;
        } while (sVar63 != local_38->num_hashes);
      }
    }
    ppVar29 = local_48;
    if ((int)local_40 == 0) {
      p_Var14 = local_48->commit_message;
      sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b5da;
      uVar31 = (*p_Var14)(ppVar29);
      local_40 = (ptls_key_schedule_t *)(ulong)((uint)(uVar31 != 0) * 2);
    }
  }
  else {
    local_40 = (ptls_key_schedule_t *)0x2;
  }
  ppVar29 = local_48;
  if ((int)local_40 == 2) goto LAB_00117197;
  if ((int)local_40 != 0) {
    return uVar31;
  }
  if ((int)local_88 == 0) {
    if ((local_58->ctx->field_0x70 & 8) != 0) {
      p_Var14 = local_48->begin_message;
      sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b73e;
      uVar31 = (*p_Var14)(ppVar29);
      if (uVar31 == 0) {
        ppVar42 = local_48->buf;
        local_88 = local_58->key_schedule;
        local_40 = (ptls_key_schedule_t *)ppVar42->off;
        sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b7e5;
        uVar31 = ptls_buffer_reserve(ppVar42,1);
        if (uVar31 == 0) {
          ppVar42->base[ppVar42->off] = '\r';
          ppVar42->off = ppVar42->off + 1;
          uVar31 = 0;
        }
        bVar66 = true;
        if (uVar31 == 0) {
          sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b81a;
          uVar31 = ptls_buffer_reserve(ppVar42,3);
          if (uVar31 == 0) {
            puVar36 = ppVar42->base;
            sVar63 = ppVar42->off;
            puVar36[sVar63 + 2] = '\0';
            puVar36 = puVar36 + sVar63;
            puVar36[0] = '\0';
            puVar36[1] = '\0';
            ppVar42->off = ppVar42->off + 3;
            uVar31 = 0;
          }
          bVar66 = true;
          if (uVar31 == 0) {
            sVar63 = ppVar42->off;
            ppVar61 = (ptls_handshake_properties_t *)local_48->buf;
            local_80 = ppVar61;
            sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b863;
            uVar31 = ptls_buffer_reserve((ptls_buffer_t *)ppVar61,1);
            ppVar61 = local_80;
            if (uVar31 == 0) {
              (local_80->field_0).client.session_ticket.base
              [(long)(local_80->field_0).client.negotiated_protocols.list] = '\0';
              ppVar1 = &(local_80->field_0).client.session_ticket;
              ppVar1->base = ppVar1->base + 1;
              uVar31 = 0;
            }
            bVar66 = true;
            if (uVar31 == 0) {
              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b89d;
              uVar31 = ptls_buffer_reserve((ptls_buffer_t *)ppVar61,2);
              ppVar61 = local_80;
              if (uVar31 == 0) {
                puVar36 = (local_80->field_0).client.session_ticket.base +
                          (long)(local_80->field_0).client.negotiated_protocols.list;
                puVar36[0] = '\0';
                puVar36[1] = '\0';
                ppVar1 = &(local_80->field_0).client.session_ticket;
                ppVar1->base = ppVar1->base + 2;
                uVar31 = 0;
              }
              if (uVar31 == 0) {
                local_38 = (ptls_key_schedule_t *)(local_80->field_0).client.session_ticket.base;
                sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b8dc;
                uVar31 = ptls_buffer_reserve((ptls_buffer_t *)ppVar61,2);
                ppVar61 = local_80;
                if (uVar31 == 0) {
                  puVar36 = (local_80->field_0).client.session_ticket.base +
                            (long)(local_80->field_0).client.negotiated_protocols.list;
                  puVar36[0] = '\0';
                  puVar36[1] = '\r';
                  ppVar1 = &(local_80->field_0).client.session_ticket;
                  ppVar1->base = ppVar1->base + 2;
                  uVar31 = 0;
                }
                bVar66 = uVar31 != 0;
                if (uVar31 == 0) {
                  sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11ba5b;
                  uVar31 = ptls_buffer_reserve((ptls_buffer_t *)ppVar61,2);
                  ppVar61 = local_80;
                  if (uVar31 == 0) {
                    puVar36 = (local_80->field_0).client.session_ticket.base +
                              (long)(local_80->field_0).client.negotiated_protocols.list;
                    puVar36[0] = '\0';
                    puVar36[1] = '\0';
                    ppVar1 = &(local_80->field_0).client.session_ticket;
                    ppVar1->base = ppVar1->base + 2;
                    uVar31 = 0;
                  }
                  bVar66 = true;
                  if (uVar31 == 0) {
                    puVar36 = (local_80->field_0).client.session_ticket.base;
                    vc = local_58->ctx->verify_certificate;
                    sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11baa2;
                    uVar31 = push_signature_algorithms(vc,(ptls_buffer_t *)ppVar61);
                    if (uVar31 == 0) {
                      uVar44 = (long)(local_80->field_0).client.session_ticket.base - (long)puVar36;
                      lVar38 = 8;
                      do {
                        puVar36[(long)((long)&(local_80->field_0).client.negotiated_protocols.list
                                              [-1].len + 6)] =
                             (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                        lVar38 = lVar38 + -8;
                        puVar36 = puVar36 + 1;
                      } while (lVar38 != -8);
                      bVar66 = false;
                      bVar68 = true;
                      uVar31 = 0;
                    }
                    else {
                      bVar68 = false;
                    }
                  }
                  else {
                    bVar68 = false;
                  }
                  if (bVar68) {
                    uVar44 = (long)(local_80->field_0).client.session_ticket.base - (long)local_38;
                    lVar38 = 8;
                    do {
                      *(char *)((long)local_38->secret +
                               (long)((long)&(local_80->field_0).client.negotiated_protocols.list
                                             [-2].len + 6)) =
                           (char)(uVar44 >> ((byte)lVar38 & 0x3f));
                      lVar38 = lVar38 + -8;
                      local_38 = (ptls_key_schedule_t *)((long)&local_38->generation + 1);
                      bVar66 = false;
                    } while (lVar38 != -8);
                  }
                }
              }
            }
            if (!bVar66) {
              uVar44 = ppVar42->off - sVar63;
              lVar38 = 0x10;
              do {
                ppVar42->base[sVar63 - 3] = (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                lVar38 = lVar38 + -8;
                sVar63 = sVar63 + 1;
              } while (lVar38 != -8);
              bVar66 = false;
            }
          }
          if (((!bVar66) && (bVar66 = false, local_88 != (ptls_key_schedule_t *)0x0)) &&
             (local_88->num_hashes != 0)) {
            local_80 = (ptls_handshake_properties_t *)
                       ((long)local_40->secret + (long)(ppVar42->base + -0x10));
            local_40 = (ptls_key_schedule_t *)(ppVar42->off - (long)local_40);
            pppVar62 = &local_88->hashes[0].ctx;
            bVar66 = false;
            sVar63 = 0;
            do {
              ppVar49 = local_40;
              ppVar61 = local_80;
              psVar12 = *pppVar62;
              p_Var13 = psVar12->update;
              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11bbdc;
              (*p_Var13)(psVar12,ppVar61,(size_t)ppVar49);
              sVar63 = sVar63 + 1;
              pppVar62 = pppVar62 + 2;
            } while (sVar63 != local_88->num_hashes);
          }
        }
        ppVar29 = local_48;
        if (!bVar66) {
          p_Var14 = local_48->commit_message;
          sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11bb62;
          uVar31 = (*p_Var14)(ppVar29);
          bVar66 = uVar31 != 0;
        }
      }
      else {
        bVar66 = true;
      }
      if (bVar66) goto LAB_00117197;
      if (bVar66) {
        return uVar31;
      }
      if (uVar31 != 0) goto LAB_00117197;
    }
    ppVar29 = local_48;
    ppVar28 = local_58;
    bVar37 = ch->field_0x4f8;
    sig[-1].hashes[0].algo = (ptls_hash_algorithm_t *)(ch->cert_compression_algos).count;
    sig[-1].num_hashes = (size_t)&ch->cert_compression_algos;
    *(ulong *)(sig[-1].secret + 0x38) = (ulong)(bVar37 & 1);
    sig[-1].secret[0x30] = '&';
    sig[-1].secret[0x31] = 0xb7;
    sig[-1].secret[0x32] = '\x11';
    sig[-1].secret[0x33] = '\0';
    sig[-1].secret[0x34] = '\0';
    sig[-1].secret[0x35] = '\0';
    sig[-1].secret[0x36] = '\0';
    sig[-1].secret[0x37] = '\0';
    uVar31 = send_certificate_and_certificate_verify
                       (ppVar28,ppVar29,&ch->signature_algorithms,(ptls_iovec_t)ZEXT816(0),
                        "TLS 1.3, server CertificateVerify",*(int *)(sig[-1].secret + 0x38),
                        (uint16_t *)sig[-1].num_hashes,(size_t)sig[-1].hashes[0].algo);
    if (uVar31 != 0) goto LAB_00117197;
  }
  ppVar29 = local_48;
  ppVar28 = local_58;
  sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b615;
  uVar31 = send_finished(ppVar28,ppVar29);
  if (uVar31 == 0) {
    ppVar49 = local_58->key_schedule;
    if (ppVar49->generation != 2) {
      sig[-1].hashes[0].ctx = (ptls_hash_context_t *)client_hello_decrypt_esni;
      __assert_fail("tls->key_schedule->generation == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0x101d,
                    "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                   );
    }
    sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b637;
    uVar31 = key_schedule_extract(ppVar49,(ptls_iovec_t)ZEXT816(0));
    ppVar28 = local_58;
    if (uVar31 == 0) {
      sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b65c;
      uVar31 = setup_traffic_protection(ppVar28,1,"s ap traffic",3,0);
      if (uVar31 == 0) {
        ppVar49 = local_58->key_schedule;
        secret = &local_58->field_18;
        sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b67f;
        uVar31 = derive_secret(ppVar49,secret,"c ap traffic");
        ppVar28 = local_58;
        if (uVar31 == 0) {
          sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b692;
          uVar31 = derive_exporter_secret(ppVar28,0);
          ppVar28 = local_58;
          if (uVar31 == 0) {
            bVar37 = local_58->ctx->field_0x70;
            if (local_58->pending_handshake_secret == (uint8_t *)0x0) {
              eVar32 = (uint)((bVar37 & 8) == 0) * 3 + PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
            }
            else {
              eVar32 = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
              if ((bVar37 & 0x10) != 0) {
                sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b6c9;
                uVar31 = commission_handshake_secret(ppVar28);
                if (uVar31 != 0) goto LAB_00117197;
                eVar32 = PTLS_STATE_SERVER_EXPECT_FINISHED;
              }
            }
            ppVar29 = local_48;
            ppVar28 = local_58;
            local_58->state = eVar32;
            if (((ch->psk).ke_modes != 0) && (local_58->ctx->ticket_lifetime != 0)) {
              sig[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11b94e;
              uVar31 = send_session_ticket(ppVar28,ppVar29);
              if (uVar31 != 0) goto LAB_00117197;
            }
            uVar31 = 0x202;
            if ((local_58->ctx->field_0x70 & 8) == 0) {
              uVar31 = 0;
            }
          }
        }
      }
    }
  }
LAB_00117197:
  pvVar26 = pvStack_1b8;
  ppVar35[-1].hashes[0].ctx = (ptls_hash_context_t *)0x1171a6;
  free(pvVar26);
  puVar36 = ecdh_secret.base;
  sVar63 = pubkey.len;
  if (pubkey.len != 0) {
    ppVar35[-1].hashes[0].ctx = (ptls_hash_context_t *)0x1171c2;
    (*ptls_clear_memory)((void *)sVar63,(size_t)puVar36);
    sVar63 = pubkey.len;
    ppVar35[-1].hashes[0].ctx = (ptls_hash_context_t *)0x1171ce;
    free((void *)sVar63);
  }
  ppVar35[-1].hashes[0].ctx = (ptls_hash_context_t *)0x1171d6;
  free(ch);
  return uVar31;
}

Assistant:

static int server_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
#define EMIT_SERVER_HELLO(sched, fill_rand, extensions)                                                                            \
    ptls_push_message(emitter, (sched), PTLS_HANDSHAKE_TYPE_SERVER_HELLO, {                                                        \
        ptls_buffer_push16(emitter->buf, 0x0303 /* legacy version */);                                                             \
        if ((ret = ptls_buffer_reserve(emitter->buf, PTLS_HELLO_RANDOM_SIZE)) != 0)                                                \
            goto Exit;                                                                                                             \
        do {                                                                                                                       \
            fill_rand                                                                                                              \
        } while (0);                                                                                                               \
        emitter->buf->off += PTLS_HELLO_RANDOM_SIZE;                                                                               \
        ptls_buffer_push_block(emitter->buf, 1,                                                                                    \
                               { ptls_buffer_pushv(emitter->buf, ch->legacy_session_id.base, ch->legacy_session_id.len); });       \
        ptls_buffer_push16(emitter->buf, tls->cipher_suite->id);                                                                   \
        ptls_buffer_push(emitter->buf, 0);                                                                                         \
        ptls_buffer_push_block(emitter->buf, 2, {                                                                                  \
            buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS,                                            \
                                  { ptls_buffer_push16(emitter->buf, ch->selected_version); });                                    \
            do {                                                                                                                   \
                extensions                                                                                                         \
            } while (0);                                                                                                           \
        });                                                                                                                        \
    }